

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution_x86::forward(Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int *piVar2;
  size_t sVar3;
  Layer *pLVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  undefined4 uVar47;
  undefined4 uVar48;
  undefined4 uVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  undefined4 uVar54;
  bool bVar55;
  bool bVar56;
  bool bVar57;
  int iVar58;
  int iVar59;
  uint uVar60;
  int iVar61;
  int iVar62;
  long lVar63;
  ulong uVar64;
  uint uVar65;
  float *pfVar66;
  undefined1 (*pauVar67) [16];
  float *pfVar68;
  bool bVar69;
  float *pfVar70;
  int iVar71;
  float *pfVar72;
  long lVar73;
  ulong uVar74;
  float *pfVar75;
  uint uVar76;
  long lVar77;
  ulong uVar78;
  undefined4 *puVar79;
  int iVar80;
  int iVar81;
  uint uVar82;
  long lVar83;
  int iVar84;
  uint M;
  int iVar85;
  long lVar86;
  byte bVar87;
  long lVar88;
  long lVar89;
  undefined1 (*pauVar90) [16];
  float *pfVar91;
  float fVar92;
  float fVar100;
  float fVar101;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  ulong uVar147;
  ulong uVar148;
  ulong uVar149;
  ulong uVar150;
  Option *in_stack_fffffffffffffdf8;
  int TILE_K;
  int TILE_N;
  int local_1cc;
  Mat local_1c8;
  Mat local_178;
  int local_130;
  int TILE_M;
  float *local_128;
  long local_120;
  Mat local_118;
  ulong local_c8;
  ulong local_c0;
  float *local_b8;
  ulong local_b0;
  long local_a8;
  uint local_9c;
  ulong local_98;
  size_t local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  long local_68;
  long local_60;
  ulong local_58;
  ulong local_50;
  long local_48;
  ulong local_40;
  long local_38;
  
  if ((opt->use_int8_inference == true) && ((this->super_Convolution).int8_scale_term != 0)) {
    iVar58 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar58;
  }
  iVar58 = (this->super_Convolution).kernel_w;
  iVar81 = (this->super_Convolution).kernel_h;
  if (iVar81 == 1 && (iVar58 == 1 && bottom_blob->dims == 1)) {
    local_118.cstep = 0;
    local_118.data = (void *)0x0;
    local_118.refcount._0_4_ = 0;
    local_118.refcount._4_4_ = 0;
    local_118.elemsize._0_4_ = 0;
    local_118.elemsize._4_4_ = 0;
    local_118.elempack = 0;
    local_118.allocator = (Allocator *)0x0;
    local_118.dims = 0;
    local_118.w = 0;
    local_118.h = 0;
    local_118.d = 0;
    local_118.c = 0;
    if ((bottom_blob->elemsize & 0xf) == 0) {
      if (&local_118 != bottom_blob) {
        piVar2 = bottom_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        local_118.data = bottom_blob->data;
        local_118.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
        local_118.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
        local_118.elemsize._0_4_ = (undefined4)bottom_blob->elemsize;
        local_118.elemsize._4_4_ = (undefined4)(bottom_blob->elemsize >> 0x20);
        local_118.elempack = bottom_blob->elempack;
        local_118.allocator = bottom_blob->allocator;
        uVar54 = bottom_blob->d;
        local_118.d = uVar54;
      }
      local_118.dims = 3;
      local_118.w = 1;
      local_118.h = 1;
      local_118.c = bottom_blob->w;
      local_118.cstep = 1;
    }
    else {
      Mat::reshape(&local_178,bottom_blob,1,1,bottom_blob->w,opt->workspace_allocator);
      piVar2 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_118.allocator == (Allocator *)0x0) {
            if (local_118.data != (void *)0x0) {
              free(local_118.data);
            }
          }
          else {
            (*(local_118.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_118.data = (void *)CONCAT44(local_178.data._4_4_,local_178.data._0_4_);
      piVar2 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
      local_118.refcount._0_4_ = local_178.refcount._0_4_;
      local_118.refcount._4_4_ = local_178.refcount._4_4_;
      local_118.elemsize._0_4_ = (uint)local_178.elemsize;
      local_118.elemsize._4_4_ = local_178.elemsize._4_4_;
      local_118.elempack = local_178.elempack;
      local_118.allocator = local_178.allocator;
      local_118.dims = local_178.dims;
      local_118.w = local_178.w;
      local_118.h = local_178.h;
      local_118.d = local_178.d;
      local_118.c = local_178.c;
      local_118.cstep = local_178.cstep;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_178.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_178.data._4_4_,local_178.data._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_178.data._4_4_,local_178.data._0_4_));
            }
          }
          else {
            (*(local_178.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar58 = -100;
      if ((local_118.data == (void *)0x0) || ((long)local_118.c * local_118.cstep == 0))
      goto LAB_0015be01;
    }
    local_178.cstep = 0;
    local_178.data._0_4_ = 0;
    local_178.data._4_4_ = 0;
    local_178.refcount._0_4_ = 0;
    local_178.refcount._4_4_ = 0;
    local_178.elemsize._0_4_ = 0;
    local_178.elemsize._4_4_ = 0;
    local_178.elempack = 0;
    local_178.allocator = (Allocator *)0x0;
    local_178.dims = 0;
    local_178.w = 0;
    local_178.h = 0;
    local_178.d = 0;
    local_178.c = 0;
    iVar58 = (*(this->super_Convolution).super_Layer._vptr_Layer[7])(this,&local_118,&local_178,opt)
    ;
    if (iVar58 == 0) {
      if (((uint)local_178.elemsize & 0xf) == 0) {
        if (&local_178 != top_blob) {
          piVar2 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + 1;
            UNLOCK();
          }
          piVar2 = top_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          top_blob->data = (void *)CONCAT44(local_178.data._4_4_,local_178.data._0_4_);
          top_blob->refcount = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
          top_blob->elemsize = CONCAT44(local_178.elemsize._4_4_,(uint)local_178.elemsize);
          top_blob->elempack = local_178.elempack;
          top_blob->allocator = local_178.allocator;
          top_blob->dims = local_178.dims;
          top_blob->w = local_178.w;
          top_blob->h = local_178.h;
          top_blob->d = local_178.d;
          top_blob->c = local_178.c;
          top_blob->cstep = local_178.cstep;
        }
        top_blob->dims = 1;
        local_118.cstep = (size_t)local_178.c;
        top_blob->w = local_178.c;
        top_blob->h = 1;
        top_blob->c = 1;
      }
      else {
        Mat::reshape(&local_1c8,&local_178,local_178.c,opt->blob_allocator);
        if (&local_1c8 != top_blob) {
          piVar2 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + 1;
            UNLOCK();
          }
          piVar2 = top_blob->refcount;
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          top_blob->data = local_1c8.data;
          top_blob->refcount = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
          top_blob->elemsize = CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize);
          top_blob->elempack = local_1c8.elempack;
          top_blob->allocator = local_1c8.allocator;
          top_blob->dims = local_1c8.dims;
          top_blob->w = local_1c8.w;
          top_blob->h = local_1c8.h;
          top_blob->d = local_1c8.d;
          top_blob->c = local_1c8.c;
          top_blob->cstep = local_1c8.cstep;
        }
        piVar2 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (local_1c8.allocator == (Allocator *)0x0) {
              if (local_1c8.data != (void *)0x0) {
                free(local_1c8.data);
              }
            }
            else {
              (*(local_1c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar58 = -100;
        if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
        goto LAB_0015bd90;
      }
      iVar58 = 0;
    }
LAB_0015bd90:
    piVar2 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_178.allocator == (Allocator *)0x0) {
          if ((void *)CONCAT44(local_178.data._4_4_,local_178.data._0_4_) != (void *)0x0) {
            free((void *)CONCAT44(local_178.data._4_4_,local_178.data._0_4_));
          }
        }
        else {
          (*(local_178.allocator)->_vptr_Allocator[3])();
        }
      }
    }
LAB_0015be01:
    local_178.cstep = 0;
    local_178.c = 0;
    local_178.d = 0;
    local_178.h = 0;
    local_178.w = 0;
    local_178.dims = 0;
    local_178.elempack = 0;
    local_178.elemsize._4_4_ = 0;
    local_178.elemsize._0_4_ = 0;
    local_178.refcount._4_4_ = 0;
    local_178.refcount._0_4_ = 0;
    local_178.data._4_4_ = 0;
    local_178.data._0_4_ = 0;
    piVar2 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_118.allocator == (Allocator *)0x0) {
          if (local_118.data != (void *)0x0) {
            free(local_118.data);
          }
        }
        else {
          (*(local_118.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    return iVar58;
  }
  iVar80 = bottom_blob->c;
  iVar84 = (this->super_Convolution).dilation_w;
  uVar78 = bottom_blob->elemsize;
  iVar61 = (this->super_Convolution).dilation_h;
  iVar71 = bottom_blob->elempack;
  local_1c8.cstep = 0;
  local_1c8.data = (void *)0x0;
  local_1c8.refcount._0_4_ = 0;
  local_1c8.refcount._4_4_ = 0;
  local_1c8.elemsize._0_4_ = 0;
  local_1c8.elemsize._4_4_ = 0;
  local_1c8.elempack = 0;
  local_1c8.allocator = (Allocator *)0x0;
  local_1c8.dims = 0;
  local_1c8.w = 0;
  local_1c8.h = 0;
  local_1c8.d = 0;
  local_1c8.c = 0;
  Convolution::make_padding(&this->super_Convolution,bottom_blob,&local_1c8,opt);
  iVar85 = local_1c8.w;
  iVar62 = -100;
  if ((local_1c8.data == (void *)0x0) || ((long)local_1c8.c * local_1c8.cstep == 0))
  goto LAB_0015bfed;
  local_c0 = CONCAT44(local_c0._4_4_,local_1c8.h);
  iVar84 = (~((iVar58 + -1) * iVar84) + local_1c8.w) / (this->super_Convolution).stride_w + 1;
  iVar81 = (~((iVar81 + -1) * iVar61) + local_1c8.h) / (this->super_Convolution).stride_h + 1;
  uVar65 = (this->super_Convolution).num_output;
  bVar87 = (uVar65 & 3) == 0 & opt->use_packing_layout;
  iVar58 = (uint)bVar87 + (uint)bVar87 * 2 + 1;
  Mat::create(top_blob,iVar84,iVar81,(int)uVar65 / iVar58,
              uVar78 / (ulong)(long)iVar71 << bVar87 * '\x02',iVar58,opt->blob_allocator);
  iVar62 = -100;
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_0015bfed;
  if ((((((opt->use_packing_layout == false) &&
         ((this->super_Convolution).kernel_w == (this->super_Convolution).kernel_h)) &&
        (iVar58 = (this->super_Convolution).dilation_w, iVar58 != 1)) &&
       ((iVar61 = (this->super_Convolution).dilation_h, iVar61 <= iVar81 && (iVar58 <= iVar84)))) &&
      (iVar61 == iVar58)) &&
     (((this->super_Convolution).stride_w == 1 && ((this->super_Convolution).stride_h == 1)))) {
    iVar62 = forwardDilation_x86(this,&local_1c8,top_blob,opt);
    goto LAB_0015bfed;
  }
  iVar80 = iVar80 * iVar71;
  bVar57 = opt->use_winograd23_convolution;
  if ((bVar57 == false) &&
     ((opt->use_winograd43_convolution == false && (opt->use_winograd63_convolution != true)))) {
    bVar69 = false;
  }
  else {
    bVar69 = true;
    if (iVar80 < 9) {
      bVar69 = 8 < (this->super_Convolution).num_output;
    }
  }
  auVar93._0_4_ = -(uint)((this->super_Convolution).kernel_w == 3);
  auVar93._4_4_ = -(uint)((this->super_Convolution).kernel_h == 3);
  auVar93._8_4_ = -(uint)((this->super_Convolution).dilation_w == 1);
  auVar93._12_4_ = -(uint)((this->super_Convolution).dilation_h == 1);
  iVar58 = movmskps((int)this,auVar93);
  if ((((iVar58 == 0xf) && ((this->super_Convolution).stride_w == 1)) &&
      ((this->super_Convolution).stride_h == 1)) &&
     ((opt->use_winograd_convolution != false && (bVar69)))) {
    iVar58 = (this->super_Convolution).num_output;
    iVar81 = (int)local_c0;
    bVar55 = test_prefer_winograd63(iVar80,iVar58,iVar85,(int)local_c0);
    bVar56 = test_prefer_winograd23(iVar80,iVar58,iVar85,iVar81);
    bVar69 = !bVar55 && !bVar56;
    if ((bVar56) &&
       (((bVar57 == false || ((this->weight_winograd23_data).data == (void *)0x0)) ||
        (bVar56 = true,
        (long)(this->weight_winograd23_data).c * (this->weight_winograd23_data).cstep == 0)))) {
      bVar69 = true;
      bVar56 = false;
    }
    if ((bVar55) &&
       (((opt->use_winograd63_convolution != true ||
         ((this->weight_winograd63_data).data == (void *)0x0)) ||
        (bVar55 = true,
        (long)(this->weight_winograd63_data).c * (this->weight_winograd63_data).cstep == 0)))) {
      bVar69 = true;
      bVar55 = false;
    }
    if ((bVar69) &&
       (((opt->use_winograd43_convolution != true ||
         ((this->weight_winograd43_data).data == (void *)0x0)) ||
        ((long)(this->weight_winograd43_data).c * (this->weight_winograd43_data).cstep == 0)))) {
      if (((opt->use_winograd63_convolution == true) &&
          ((this->weight_winograd63_data).data != (void *)0x0)) &&
         ((long)(this->weight_winograd63_data).c * (this->weight_winograd63_data).cstep != 0)) {
        bVar55 = true;
      }
      else {
        bVar56 = true;
      }
      bVar69 = false;
    }
    iVar58 = this->nT;
    iVar81 = iVar58;
    if (iVar58 == 0) {
      iVar81 = opt->num_threads;
    }
    if (opt->num_threads != iVar58 && iVar58 != 0) {
      forward();
    }
    if (bVar56 == false) {
      if (bVar69) {
        iVar62 = conv3x3s1_winograd43
                           (&local_1c8,top_blob,&this->weight_winograd43_data,
                            &(this->super_Convolution).bias_data,iVar81,opt);
      }
      else {
        iVar62 = 0;
        if (bVar55 != false) {
          iVar62 = conv3x3s1_winograd63
                             (&local_1c8,top_blob,&this->weight_winograd63_data,
                              &(this->super_Convolution).bias_data,iVar81,opt);
        }
      }
    }
    else {
      iVar62 = conv3x3s1_winograd23
                         (&local_1c8,top_blob,&this->weight_winograd23_data,
                          &(this->super_Convolution).bias_data,iVar81,opt);
    }
    if (iVar62 == 0) {
      pLVar4 = this->activation;
      iVar62 = 0;
      if (pLVar4 != (Layer *)0x0) {
        (*pLVar4->_vptr_Layer[9])(pLVar4,top_blob,opt);
        iVar62 = 0;
      }
    }
    goto LAB_0015bfed;
  }
  iVar59 = get_cpu_level2_cache_size();
  iVar58 = (this->super_Convolution).num_output;
  uVar65 = (this->super_Convolution).kernel_w;
  iVar81 = (this->super_Convolution).kernel_h;
  iVar84 = (this->super_Convolution).dilation_w;
  iVar61 = (this->super_Convolution).dilation_h;
  iVar85 = (this->super_Convolution).stride_w;
  iVar62 = (this->super_Convolution).stride_h;
  if (((opt->use_sgemm_convolution != true) ||
      ((int)(iVar85 * iVar62 * iVar81 * iVar84 * iVar61 * iVar58 * uVar65 * iVar80 * 8) <= iVar59 &&
       (iVar80 < 0x11 && iVar58 < 0x11))) && (iVar81 != 1 || uVar65 != 1)) {
    if (bVar87 == 1 && iVar71 == 1) {
      bVar57 = iVar81 != 3 || uVar65 != 3;
      if ((iVar62 != 1 || iVar85 != 1) || (iVar61 != 1 || (iVar84 != 1 || bVar57))) {
        if ((iVar61 != 1 || (iVar84 != 1 || bVar57)) || (iVar62 != 2 || iVar85 != 2))
        goto LAB_0015bec0;
        conv3x3s2_pack1to4_sse
                  (&local_1c8,top_blob,&this->weight_data_tm,&(this->super_Convolution).bias_data,
                   (Option *)(ulong)uVar65);
      }
      else {
        conv3x3s1_pack1to4_sse
                  (&local_1c8,top_blob,&this->weight_data_tm,&(this->super_Convolution).bias_data,
                   (Option *)(ulong)uVar65);
      }
      pLVar4 = this->activation;
      if (pLVar4 != (Layer *)0x0) {
        (*pLVar4->_vptr_Layer[9])(pLVar4,top_blob,opt);
      }
    }
    else {
LAB_0015bec0:
      convolution_packed(&local_1c8,top_blob,&this->weight_data_tm,
                         &(this->super_Convolution).bias_data,uVar65,iVar81,iVar84,iVar61,iVar85,
                         iVar62,(this->super_Convolution).activation_type,
                         &(this->super_Convolution).activation_params,in_stack_fffffffffffffdf8);
    }
    iVar62 = 0;
    goto LAB_0015bfed;
  }
  uVar65 = this->nT;
  uVar82 = uVar65;
  if (uVar65 == 0) {
    uVar82 = opt->num_threads;
  }
  if (opt->num_threads != uVar65 && uVar65 != 0) {
    forward();
  }
  uVar65 = (this->super_Convolution).kernel_w;
  local_b0 = (ulong)uVar65;
  uVar76 = (this->super_Convolution).kernel_h;
  local_70 = (ulong)uVar76;
  local_78 = (ulong)(uint)(this->super_Convolution).dilation_w;
  local_80 = (ulong)(uint)(this->super_Convolution).dilation_h;
  local_88 = (ulong)(uint)(this->super_Convolution).stride_w;
  local_c8 = (ulong)(uint)(this->super_Convolution).stride_h;
  M = top_blob->elempack * top_blob->c;
  uVar60 = top_blob->h * top_blob->w;
  uVar78 = (ulong)uVar60;
  iVar80 = uVar76 * uVar65 * local_1c8.c * local_1c8.elempack;
  local_50 = (ulong)uVar82;
  convolution_im2col_gemm_get_optimal_tile_mnk(M,uVar60,iVar80,&TILE_M,&TILE_N,&TILE_K,uVar82);
  local_9c = (int)(M + TILE_M + -1) / TILE_M;
  iVar81 = (int)(TILE_N + uVar60 + -1) / TILE_N;
  iVar58 = (iVar80 + TILE_K + -1) / TILE_K;
  local_118.cstep = 0;
  local_118.data = (void *)0x0;
  local_118.refcount._0_4_ = 0;
  local_118.refcount._4_4_ = 0;
  local_118.elemsize._0_4_ = 0;
  local_118.elemsize._4_4_ = 0;
  local_118.elempack = 0;
  local_118.allocator = (Allocator *)0x0;
  local_118.dims = 0;
  local_118.w = 0;
  local_118.h = 0;
  local_118.d = 0;
  local_118.c = 0;
  local_60 = CONCAT44(local_60._4_4_,iVar58);
  Mat::create(&local_118,TILE_K * TILE_N,iVar58,iVar81,4,opt->workspace_allocator);
  iVar62 = -100;
  if ((local_118.data != (void *)0x0) && ((long)local_118.c * local_118.cstep != 0)) {
    iVar81 = iVar81 * (int)local_60;
    local_48 = CONCAT44(local_48._4_4_,iVar81);
    local_98 = uVar78;
    local_40 = (ulong)M;
    if (0 < iVar81) {
      iVar58 = (int)local_b0;
      iVar81 = (int)local_70;
      bVar55 = iVar81 == 1 && iVar58 == 1;
      bVar57 = (int)local_80 == 1 && (int)local_78 == 1;
      bVar56 = (int)local_c8 == 1 && (int)local_88 == 1;
      local_128 = (float *)CONCAT71(local_128._1_7_,(bVar55 && bVar57) && bVar56);
      bVar69 = (int)local_c8 == 2 && (int)local_88 == 2;
      local_a8 = CONCAT71(local_a8._1_7_,bVar55 && bVar69);
      bVar55 = (iVar81 == 3 && iVar58 == 3) && bVar57;
      local_68 = CONCAT71(local_68._1_7_,bVar55 && bVar56);
      local_90 = CONCAT71(local_90._1_7_,bVar55 && bVar69);
      bVar55 = (iVar81 == 5 && iVar58 == 5) && bVar57;
      local_1cc = CONCAT31(local_1cc._1_3_,bVar56 && bVar55);
      local_130 = CONCAT31(local_130._1_3_,bVar55 && bVar69);
      local_b8 = (float *)CONCAT71(local_b8._1_7_,((iVar81 == 7 && iVar58 == 7) && bVar57) && bVar69
                                  );
      uVar74 = 0;
      do {
        iVar58 = (int)uVar74 / (int)local_60;
        uVar150 = (long)(int)uVar74 % (long)(int)local_60;
        iVar84 = TILE_N * iVar58;
        iVar81 = TILE_K * (int)uVar150;
        uVar65 = (int)uVar78 - iVar84;
        if (TILE_N < (int)uVar65) {
          uVar65 = TILE_N;
        }
        iVar61 = iVar80 - iVar81;
        if (TILE_K < iVar80 - iVar81) {
          iVar61 = TILE_K;
        }
        local_178.cstep = (size_t)local_118.w;
        local_178.data =
             (void *)((long)local_118.data +
                     (uVar150 & 0xffffffff) * local_178.cstep *
                     CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize) +
                     (long)iVar58 * local_118.cstep *
                     CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize));
        local_178.refcount._0_4_ = 0;
        local_178.refcount._4_4_ = 0;
        local_178.elemsize._0_4_ = (undefined4)local_118.elemsize;
        local_178.elemsize._4_4_ = local_118.elemsize._4_4_;
        local_178.elempack = local_118.elempack;
        local_178.allocator = local_118.allocator;
        local_178.dims = 2;
        local_178.w = local_118.w;
        local_178.h = 1;
        local_178.d = 1;
        local_178.c = 1;
        local_c0 = uVar74;
        if ((char)local_128 == '\0') {
          if ((char)local_a8 == '\0') {
            if ((char)local_68 != '\0') {
              uVar150 = 1;
              uVar74 = 1;
LAB_0015a34d:
              uVar64 = 3;
              goto LAB_0015a354;
            }
            if ((char)local_90 != '\0') {
              uVar150 = 2;
              uVar74 = 2;
              goto LAB_0015a34d;
            }
            if ((char)local_1cc != '\0') {
              uVar150 = 1;
              uVar74 = 1;
LAB_0015a433:
              uVar64 = 5;
              goto LAB_0015a354;
            }
            if ((char)local_130 != '\0') {
              uVar150 = 2;
              uVar74 = 2;
              goto LAB_0015a433;
            }
            uVar64 = local_b0;
            uVar147 = local_70;
            uVar148 = local_78;
            uVar149 = local_80;
            uVar74 = local_88;
            uVar150 = local_c8;
            if ((char)local_b8 != '\0') {
              uVar150 = 2;
              uVar74 = 2;
              uVar64 = 7;
              goto LAB_0015a354;
            }
          }
          else {
            uVar150 = 2;
            uVar74 = 2;
            uVar64 = 1;
LAB_0015a354:
            uVar147 = uVar64;
            uVar148 = 1;
            uVar149 = 1;
          }
          convolution_im2col_input_tile_impl
                    (&local_1c8,&local_178,iVar84,uVar65,iVar81,iVar61,(int)uVar64,(int)uVar147,
                     (int)uVar148,(int)uVar149,(int)uVar74,(int)uVar150);
        }
        else {
          lVar86 = 0;
          lVar63 = (long)iVar81;
          lVar73 = (long)iVar84;
          local_120 = CONCAT44(local_120._4_4_,local_1c8.elempack);
          pauVar67 = (undefined1 (*) [16])local_178.data;
          if (0xb < (int)uVar65) {
            iVar58 = iVar81 + 3;
            if (-1 < iVar81) {
              iVar58 = iVar81;
            }
            iVar84 = iVar61 + 3;
            if (-1 < iVar61) {
              iVar84 = iVar61;
            }
            lVar77 = 0;
            do {
              if (3 < iVar61 && local_1c8.elempack == 4) {
                puVar79 = (undefined4 *)
                          ((long)local_1c8.data +
                          (lVar77 + lVar73) * 0x10 +
                          local_1c8.cstep * (long)(iVar58 >> 2) *
                          CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize));
                iVar71 = iVar84 >> 2;
                do {
                  uVar7 = puVar79[1];
                  uVar8 = puVar79[2];
                  uVar9 = puVar79[4];
                  uVar10 = puVar79[5];
                  uVar11 = puVar79[6];
                  uVar12 = puVar79[8];
                  uVar13 = puVar79[9];
                  uVar14 = puVar79[10];
                  uVar15 = puVar79[0xc];
                  uVar16 = puVar79[0xd];
                  uVar17 = puVar79[0xe];
                  uVar18 = puVar79[0x10];
                  uVar19 = puVar79[0x11];
                  uVar20 = puVar79[0x12];
                  uVar21 = puVar79[0x13];
                  uVar22 = puVar79[0x14];
                  uVar23 = puVar79[0x15];
                  uVar24 = puVar79[0x16];
                  uVar25 = puVar79[0x17];
                  uVar26 = puVar79[0x18];
                  uVar27 = puVar79[0x19];
                  uVar28 = puVar79[0x1a];
                  uVar29 = puVar79[0x1b];
                  uVar30 = puVar79[0x1c];
                  uVar31 = puVar79[0x1d];
                  uVar32 = puVar79[0x1e];
                  uVar33 = puVar79[0x1f];
                  uVar34 = puVar79[0x20];
                  uVar35 = puVar79[0x21];
                  uVar36 = puVar79[0x22];
                  uVar37 = puVar79[0x23];
                  uVar38 = puVar79[0x24];
                  uVar39 = puVar79[0x25];
                  uVar40 = puVar79[0x26];
                  uVar41 = puVar79[0x27];
                  uVar42 = puVar79[0x28];
                  uVar43 = puVar79[0x29];
                  uVar44 = puVar79[0x2a];
                  uVar45 = puVar79[0x2b];
                  uVar46 = puVar79[0x2c];
                  uVar47 = puVar79[0x2d];
                  uVar48 = puVar79[0x2e];
                  uVar49 = puVar79[0x2f];
                  auVar94._4_4_ = uVar17;
                  auVar94._0_4_ = uVar14;
                  auVar94._8_4_ = puVar79[0xb];
                  auVar94._12_4_ = puVar79[0xf];
                  auVar95._8_8_ = auVar94._8_8_;
                  auVar95._4_4_ = puVar79[7];
                  auVar95._0_4_ = puVar79[3];
                  *(undefined4 *)*pauVar67 = *puVar79;
                  *(undefined4 *)(*pauVar67 + 4) = uVar9;
                  *(undefined4 *)(*pauVar67 + 8) = uVar12;
                  *(undefined4 *)(*pauVar67 + 0xc) = uVar15;
                  *(undefined4 *)pauVar67[1] = uVar18;
                  *(undefined4 *)(pauVar67[1] + 4) = uVar22;
                  *(undefined4 *)(pauVar67[1] + 8) = uVar26;
                  *(undefined4 *)(pauVar67[1] + 0xc) = uVar30;
                  *(undefined4 *)pauVar67[2] = uVar34;
                  *(undefined4 *)(pauVar67[2] + 4) = uVar38;
                  *(undefined4 *)(pauVar67[2] + 8) = uVar42;
                  *(undefined4 *)(pauVar67[2] + 0xc) = uVar46;
                  *(undefined4 *)pauVar67[3] = uVar7;
                  *(undefined4 *)(pauVar67[3] + 4) = uVar10;
                  *(undefined4 *)(pauVar67[3] + 8) = uVar13;
                  *(undefined4 *)(pauVar67[3] + 0xc) = uVar16;
                  *(undefined4 *)pauVar67[4] = uVar19;
                  *(undefined4 *)(pauVar67[4] + 4) = uVar23;
                  *(undefined4 *)(pauVar67[4] + 8) = uVar27;
                  *(undefined4 *)(pauVar67[4] + 0xc) = uVar31;
                  *(undefined4 *)pauVar67[5] = uVar35;
                  *(undefined4 *)(pauVar67[5] + 4) = uVar39;
                  *(undefined4 *)(pauVar67[5] + 8) = uVar43;
                  *(undefined4 *)(pauVar67[5] + 0xc) = uVar47;
                  *(undefined4 *)pauVar67[6] = uVar8;
                  *(undefined4 *)(pauVar67[6] + 4) = uVar11;
                  *(undefined4 *)(pauVar67[6] + 8) = uVar14;
                  *(undefined4 *)(pauVar67[6] + 0xc) = uVar17;
                  *(undefined4 *)pauVar67[7] = uVar20;
                  *(undefined4 *)(pauVar67[7] + 4) = uVar24;
                  *(undefined4 *)(pauVar67[7] + 8) = uVar28;
                  *(undefined4 *)(pauVar67[7] + 0xc) = uVar32;
                  *(undefined4 *)pauVar67[8] = uVar36;
                  *(undefined4 *)(pauVar67[8] + 4) = uVar40;
                  *(undefined4 *)(pauVar67[8] + 8) = uVar44;
                  *(undefined4 *)(pauVar67[8] + 0xc) = uVar48;
                  pauVar67[9] = auVar95;
                  *(undefined4 *)pauVar67[10] = uVar21;
                  *(undefined4 *)(pauVar67[10] + 4) = uVar25;
                  *(undefined4 *)(pauVar67[10] + 8) = uVar29;
                  *(undefined4 *)(pauVar67[10] + 0xc) = uVar33;
                  *(undefined4 *)pauVar67[0xb] = uVar37;
                  *(undefined4 *)(pauVar67[0xb] + 4) = uVar41;
                  *(undefined4 *)(pauVar67[0xb] + 8) = uVar45;
                  *(undefined4 *)(pauVar67[0xb] + 0xc) = uVar49;
                  pauVar67 = pauVar67 + 0xc;
                  puVar79 = puVar79 + local_1c8.cstep * 4;
                  iVar71 = iVar71 + -1;
                } while (iVar71 != 0);
              }
              if (local_1c8.elempack == 1 && 0 < iVar61) {
                pauVar90 = (undefined1 (*) [16])
                           ((long)local_1c8.data +
                           lVar73 * 4 +
                           lVar77 * 4 +
                           local_1c8.cstep * lVar63 *
                           CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize));
                iVar71 = iVar61;
                do {
                  uVar7 = *(undefined4 *)pauVar90[1];
                  uVar8 = *(undefined4 *)(pauVar90[1] + 4);
                  uVar9 = *(undefined4 *)(pauVar90[1] + 8);
                  uVar10 = *(undefined4 *)(pauVar90[1] + 0xc);
                  uVar11 = *(undefined4 *)pauVar90[2];
                  uVar12 = *(undefined4 *)(pauVar90[2] + 4);
                  uVar13 = *(undefined4 *)(pauVar90[2] + 8);
                  uVar14 = *(undefined4 *)(pauVar90[2] + 0xc);
                  *pauVar67 = *pauVar90;
                  *(undefined4 *)pauVar67[1] = uVar7;
                  *(undefined4 *)(pauVar67[1] + 4) = uVar8;
                  *(undefined4 *)(pauVar67[1] + 8) = uVar9;
                  *(undefined4 *)(pauVar67[1] + 0xc) = uVar10;
                  *(undefined4 *)pauVar67[2] = uVar11;
                  *(undefined4 *)(pauVar67[2] + 4) = uVar12;
                  *(undefined4 *)(pauVar67[2] + 8) = uVar13;
                  *(undefined4 *)(pauVar67[2] + 0xc) = uVar14;
                  pauVar67 = pauVar67 + 3;
                  pauVar90 = (undefined1 (*) [16])(*pauVar90 + local_1c8.cstep * 4);
                  iVar71 = iVar71 + -1;
                } while (iVar71 != 0);
              }
              lVar86 = lVar77 + 0xc;
              uVar74 = lVar77 + 0x17;
              lVar77 = lVar86;
              uVar78 = local_98;
            } while (uVar74 < uVar65);
          }
          lVar77 = (long)(int)uVar65;
          if ((int)lVar86 + 7 < (int)uVar65) {
            iVar58 = iVar81 + 3;
            if (-1 < iVar81) {
              iVar58 = iVar81;
            }
            iVar84 = iVar61 + 3;
            if (-1 < iVar61) {
              iVar84 = iVar61;
            }
            lVar83 = (long)(int)lVar86;
            do {
              if (3 < iVar61 && local_1c8.elempack == 4) {
                puVar79 = (undefined4 *)
                          ((long)local_1c8.data +
                          (lVar83 + lVar73) * 0x10 +
                          local_1c8.cstep * (long)(iVar58 >> 2) *
                          CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize));
                iVar71 = iVar84 >> 2;
                do {
                  uVar7 = puVar79[1];
                  uVar8 = puVar79[2];
                  uVar9 = puVar79[4];
                  uVar10 = puVar79[5];
                  uVar11 = puVar79[6];
                  uVar12 = puVar79[8];
                  uVar13 = puVar79[9];
                  uVar14 = puVar79[10];
                  uVar15 = puVar79[0xc];
                  uVar16 = puVar79[0xd];
                  uVar17 = puVar79[0xe];
                  uVar18 = puVar79[0x10];
                  uVar19 = puVar79[0x11];
                  uVar20 = puVar79[0x12];
                  uVar21 = puVar79[0x13];
                  uVar22 = puVar79[0x14];
                  uVar23 = puVar79[0x15];
                  uVar24 = puVar79[0x16];
                  uVar25 = puVar79[0x17];
                  uVar26 = puVar79[0x18];
                  uVar27 = puVar79[0x19];
                  uVar28 = puVar79[0x1a];
                  uVar29 = puVar79[0x1b];
                  uVar30 = puVar79[0x1c];
                  uVar31 = puVar79[0x1d];
                  uVar32 = puVar79[0x1e];
                  uVar33 = puVar79[0x1f];
                  auVar96._4_4_ = uVar17;
                  auVar96._0_4_ = uVar14;
                  auVar96._8_4_ = puVar79[0xb];
                  auVar96._12_4_ = puVar79[0xf];
                  auVar97._8_8_ = auVar96._8_8_;
                  auVar97._4_4_ = puVar79[7];
                  auVar97._0_4_ = puVar79[3];
                  *(undefined4 *)*pauVar67 = *puVar79;
                  *(undefined4 *)(*pauVar67 + 4) = uVar9;
                  *(undefined4 *)(*pauVar67 + 8) = uVar12;
                  *(undefined4 *)(*pauVar67 + 0xc) = uVar15;
                  *(undefined4 *)pauVar67[1] = uVar18;
                  *(undefined4 *)(pauVar67[1] + 4) = uVar22;
                  *(undefined4 *)(pauVar67[1] + 8) = uVar26;
                  *(undefined4 *)(pauVar67[1] + 0xc) = uVar30;
                  *(undefined4 *)pauVar67[2] = uVar7;
                  *(undefined4 *)(pauVar67[2] + 4) = uVar10;
                  *(undefined4 *)(pauVar67[2] + 8) = uVar13;
                  *(undefined4 *)(pauVar67[2] + 0xc) = uVar16;
                  *(undefined4 *)pauVar67[3] = uVar19;
                  *(undefined4 *)(pauVar67[3] + 4) = uVar23;
                  *(undefined4 *)(pauVar67[3] + 8) = uVar27;
                  *(undefined4 *)(pauVar67[3] + 0xc) = uVar31;
                  *(undefined4 *)pauVar67[4] = uVar8;
                  *(undefined4 *)(pauVar67[4] + 4) = uVar11;
                  *(undefined4 *)(pauVar67[4] + 8) = uVar14;
                  *(undefined4 *)(pauVar67[4] + 0xc) = uVar17;
                  *(undefined4 *)pauVar67[5] = uVar20;
                  *(undefined4 *)(pauVar67[5] + 4) = uVar24;
                  *(undefined4 *)(pauVar67[5] + 8) = uVar28;
                  *(undefined4 *)(pauVar67[5] + 0xc) = uVar32;
                  pauVar67[6] = auVar97;
                  *(undefined4 *)pauVar67[7] = uVar21;
                  *(undefined4 *)(pauVar67[7] + 4) = uVar25;
                  *(undefined4 *)(pauVar67[7] + 8) = uVar29;
                  *(undefined4 *)(pauVar67[7] + 0xc) = uVar33;
                  pauVar67 = pauVar67 + 8;
                  puVar79 = puVar79 + local_1c8.cstep * 4;
                  iVar71 = iVar71 + -1;
                } while (iVar71 != 0);
              }
              if (local_1c8.elempack == 1 && 0 < iVar61) {
                pauVar90 = (undefined1 (*) [16])
                           ((long)local_1c8.data +
                           lVar73 * 4 +
                           lVar83 * 4 +
                           local_1c8.cstep * lVar63 *
                           CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize));
                iVar71 = iVar61;
                do {
                  uVar7 = *(undefined4 *)pauVar90[1];
                  uVar8 = *(undefined4 *)(pauVar90[1] + 4);
                  uVar9 = *(undefined4 *)(pauVar90[1] + 8);
                  uVar10 = *(undefined4 *)(pauVar90[1] + 0xc);
                  *pauVar67 = *pauVar90;
                  *(undefined4 *)pauVar67[1] = uVar7;
                  *(undefined4 *)(pauVar67[1] + 4) = uVar8;
                  *(undefined4 *)(pauVar67[1] + 8) = uVar9;
                  *(undefined4 *)(pauVar67[1] + 0xc) = uVar10;
                  pauVar67 = pauVar67 + 2;
                  pauVar90 = (undefined1 (*) [16])(*pauVar90 + local_1c8.cstep * 4);
                  iVar71 = iVar71 + -1;
                } while (iVar71 != 0);
              }
              lVar86 = lVar83 + 8;
              bVar57 = lVar83 < lVar77 + -0xf;
              uVar78 = local_98;
              lVar83 = lVar86;
            } while (bVar57);
          }
          if ((int)((uint)lVar86 | 3) < (int)uVar65) {
            iVar58 = iVar81 + 3;
            if (-1 < iVar81) {
              iVar58 = iVar81;
            }
            iVar84 = iVar61 + 3;
            if (-1 < iVar61) {
              iVar84 = iVar61;
            }
            lVar83 = (long)(int)(uint)lVar86;
            do {
              if (3 < iVar61 && local_1c8.elempack == 4) {
                puVar79 = (undefined4 *)
                          ((long)local_1c8.data +
                          (lVar83 + lVar73) * 0x10 +
                          local_1c8.cstep * (long)(iVar58 >> 2) *
                          CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize));
                iVar71 = iVar84 >> 2;
                do {
                  uVar7 = puVar79[1];
                  uVar8 = puVar79[4];
                  uVar9 = puVar79[5];
                  uVar10 = puVar79[8];
                  uVar11 = puVar79[9];
                  uVar12 = puVar79[10];
                  uVar13 = puVar79[0xb];
                  uVar14 = puVar79[0xc];
                  uVar15 = puVar79[0xd];
                  uVar16 = puVar79[0xe];
                  uVar17 = puVar79[0xf];
                  auVar98._0_8_ = CONCAT44(puVar79[6],puVar79[2]);
                  auVar98._8_4_ = puVar79[3];
                  auVar98._12_4_ = puVar79[7];
                  *(undefined4 *)*pauVar67 = *puVar79;
                  *(undefined4 *)(*pauVar67 + 4) = uVar8;
                  *(undefined4 *)(*pauVar67 + 8) = uVar10;
                  *(undefined4 *)(*pauVar67 + 0xc) = uVar14;
                  *(undefined4 *)pauVar67[1] = uVar7;
                  *(undefined4 *)(pauVar67[1] + 4) = uVar9;
                  *(undefined4 *)(pauVar67[1] + 8) = uVar11;
                  *(undefined4 *)(pauVar67[1] + 0xc) = uVar15;
                  auVar6._8_4_ = uVar12;
                  auVar6._0_8_ = auVar98._0_8_;
                  auVar6._12_4_ = uVar16;
                  pauVar67[2] = auVar6;
                  auVar5._8_4_ = uVar13;
                  auVar5._0_8_ = auVar98._8_8_;
                  auVar5._12_4_ = uVar17;
                  pauVar67[3] = auVar5;
                  pauVar67 = pauVar67 + 4;
                  puVar79 = puVar79 + local_1c8.cstep * 4;
                  iVar71 = iVar71 + -1;
                } while (iVar71 != 0);
              }
              if (local_1c8.elempack == 1 && 0 < iVar61) {
                pauVar90 = (undefined1 (*) [16])
                           ((long)local_1c8.data +
                           lVar73 * 4 +
                           lVar83 * 4 +
                           local_1c8.cstep * lVar63 *
                           CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize));
                iVar71 = iVar61;
                do {
                  *pauVar67 = *pauVar90;
                  pauVar67 = pauVar67 + 1;
                  pauVar90 = (undefined1 (*) [16])(*pauVar90 + local_1c8.cstep * 4);
                  iVar71 = iVar71 + -1;
                } while (iVar71 != 0);
              }
              lVar86 = lVar83 + 4;
              lVar88 = lVar83 + 7;
              lVar83 = lVar86;
            } while (lVar88 < lVar77);
          }
          uVar82 = (uint)lVar86;
          if ((int)(uVar82 | 1) < (int)uVar65) {
            iVar58 = iVar81 + 3;
            if (-1 < iVar81) {
              iVar58 = iVar81;
            }
            iVar84 = iVar61 + 3;
            if (-1 < iVar61) {
              iVar84 = iVar61;
            }
            lVar83 = lVar73 * 4 + (long)(int)uVar82 * 4;
            lVar88 = (long)(int)uVar82;
            do {
              if (3 < iVar61 && local_1c8.elempack == 4) {
                puVar79 = (undefined4 *)
                          ((long)local_1c8.data +
                          (lVar88 + lVar73) * 0x10 +
                          local_1c8.cstep * (long)(iVar58 >> 2) *
                          CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize));
                iVar71 = iVar84 >> 2;
                do {
                  uVar7 = puVar79[1];
                  uVar8 = puVar79[4];
                  uVar9 = puVar79[5];
                  auVar99._4_4_ = puVar79[6];
                  auVar99._0_4_ = puVar79[2];
                  auVar99._8_4_ = puVar79[3];
                  auVar99._12_4_ = puVar79[7];
                  *(undefined4 *)*pauVar67 = *puVar79;
                  *(undefined4 *)(*pauVar67 + 4) = uVar8;
                  *(undefined4 *)(*pauVar67 + 8) = uVar7;
                  *(undefined4 *)(*pauVar67 + 0xc) = uVar9;
                  pauVar67[1] = auVar99;
                  pauVar67 = pauVar67 + 2;
                  puVar79 = puVar79 + local_1c8.cstep * 4;
                  iVar71 = iVar71 + -1;
                } while (iVar71 != 0);
              }
              if (local_1c8.elempack == 1 && 0 < iVar61) {
                puVar79 = (undefined4 *)
                          (local_1c8.cstep * lVar63 *
                           CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize) +
                           lVar83 + (long)local_1c8.data);
                iVar71 = iVar61;
                do {
                  *(undefined4 *)*pauVar67 = *puVar79;
                  *(undefined4 *)(*pauVar67 + 4) = puVar79[1];
                  pauVar67 = (undefined1 (*) [16])(*pauVar67 + 8);
                  puVar79 = puVar79 + local_1c8.cstep;
                  iVar71 = iVar71 + -1;
                } while (iVar71 != 0);
              }
              lVar86 = lVar88 + 2;
              lVar89 = lVar88 + 3;
              lVar83 = lVar83 + 8;
              uVar78 = local_98;
              lVar88 = lVar86;
            } while (lVar89 < lVar77);
          }
          if ((int)lVar86 < (int)uVar65) {
            iVar58 = iVar81 + 3;
            if (-1 < iVar81) {
              iVar58 = iVar81;
            }
            iVar81 = iVar61 + 3;
            if (-1 < iVar61) {
              iVar81 = iVar61;
            }
            lVar83 = (long)(int)lVar86;
            lVar86 = lVar73 * 4 + lVar83 * 4;
            do {
              if (3 < iVar61 && local_1c8.elempack == 4) {
                pauVar90 = (undefined1 (*) [16])
                           ((long)local_1c8.data +
                           (lVar83 + lVar73) * 0x10 +
                           local_1c8.cstep * (long)(iVar58 >> 2) *
                           CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize));
                iVar84 = iVar81 >> 2;
                do {
                  *pauVar67 = *pauVar90;
                  pauVar67 = pauVar67 + 1;
                  pauVar90 = pauVar90 + local_1c8.cstep;
                  iVar84 = iVar84 + -1;
                } while (iVar84 != 0);
              }
              if (local_1c8.elempack == 1 && 0 < iVar61) {
                puVar79 = (undefined4 *)
                          (local_1c8.cstep * lVar63 *
                           CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize) +
                           lVar86 + (long)local_1c8.data);
                iVar84 = iVar61;
                do {
                  *(undefined4 *)*pauVar67 = *puVar79;
                  pauVar67 = (undefined1 (*) [16])(*pauVar67 + 4);
                  puVar79 = puVar79 + local_1c8.cstep;
                  iVar84 = iVar84 + -1;
                } while (iVar84 != 0);
              }
              lVar83 = lVar83 + 1;
              lVar86 = lVar86 + 4;
            } while (lVar83 != lVar77);
          }
        }
        piVar2 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (local_178.allocator == (Allocator *)0x0) {
              if ((undefined1 (*) [16])local_178.data != (undefined1 (*) [16])0x0) {
                free(local_178.data);
              }
            }
            else {
              (*(local_178.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        uVar65 = (int)local_c0 + 1;
        uVar74 = (ulong)uVar65;
      } while (uVar65 != (uint)local_48);
    }
    local_178.cstep = 0;
    local_178.data._0_4_ = 0;
    local_178.data._4_4_ = 0;
    local_178.refcount._0_4_ = 0;
    local_178.refcount._4_4_ = 0;
    local_178.elemsize._0_4_ = 0;
    local_178.elemsize._4_4_ = 0;
    local_178.elempack = 0;
    local_178.allocator = (Allocator *)0x0;
    local_178.dims = 0;
    local_178.w = 0;
    local_178.h = 0;
    local_178.d = 0;
    local_178.c = 0;
    if (TILE_K < iVar80) {
      Mat::create(&local_178,TILE_M * TILE_N,1,(int)local_50,4,opt->workspace_allocator);
      iVar62 = -100;
      if ((CONCAT44(local_178.data._4_4_,local_178.data._0_4_) != 0) &&
         ((long)local_178.c * local_178.cstep != 0)) goto LAB_0015a60c;
    }
    else {
LAB_0015a60c:
      if (0 < (int)local_9c) {
        local_58 = 0;
        do {
          iVar58 = TILE_M;
          if (TILE_K < iVar80) {
            iVar81 = get_omp_thread_num();
            local_b8 = (float *)((long)iVar81 * local_178.cstep *
                                 CONCAT44(local_178.elemsize._4_4_,(uint)local_178.elemsize) +
                                CONCAT44(local_178.data._4_4_,local_178.data._0_4_));
          }
          else {
            local_b8 = (float *)0x0;
          }
          local_130 = iVar58 * (int)local_58;
          uVar65 = (int)local_40 - local_130;
          if (iVar58 < (int)uVar65) {
            uVar65 = iVar58;
          }
          local_c8 = CONCAT44(local_c8._4_4_,uVar65);
          if (0 < (int)uVar78) {
            local_a8 = (long)local_130;
            local_b0 = (ulong)uVar65;
            local_88 = (ulong)(int)uVar65;
            iVar58 = 0;
            do {
              local_1cc = iVar58;
              uVar82 = (int)uVar78 - local_1cc;
              if (TILE_N < (int)uVar82) {
                uVar82 = TILE_N;
              }
              if (0 < iVar80) {
                local_68 = (long)local_1cc;
                iVar58 = 0;
                do {
                  iVar84 = iVar80 - iVar58;
                  lVar86 = (long)TILE_K;
                  local_50 = CONCAT44(local_50._4_4_,iVar84);
                  iVar81 = iVar84;
                  if (TILE_K < iVar84) {
                    iVar81 = TILE_K;
                  }
                  sVar3 = (this->weight_sgemm_data).elemsize;
                  pfVar70 = (float *)(this->super_Convolution).bias_data.data;
                  pfVar72 = (float *)((long)(this->weight_sgemm_data).data +
                                     (long)(this->weight_sgemm_data).w * sVar3 *
                                     (long)(iVar58 / TILE_K) +
                                     (long)(local_130 / TILE_M) * (this->weight_sgemm_data).cstep *
                                     sVar3);
                  local_128 = (float *)((long)local_118.data +
                                       (long)local_118.w *
                                       CONCAT44(local_118.elemsize._4_4_,
                                                (undefined4)local_118.elemsize) *
                                       (long)(iVar58 / TILE_K) +
                                       (long)(local_1cc / TILE_N) * local_118.cstep *
                                       CONCAT44(local_118.elemsize._4_4_,
                                                (undefined4)local_118.elemsize));
                  iVar61 = TILE_K + iVar58;
                  local_90 = top_blob->cstep;
                  iVar71 = (int)local_90;
                  pfVar75 = local_b8;
                  if ((int)uVar65 < 4) {
                    uVar78 = 0;
                  }
                  else {
                    iVar85 = top_blob->elempack;
                    local_78 = (ulong)(iVar85 * local_1cc);
                    lVar73 = (long)iVar71;
                    lVar77 = (long)(iVar71 * 2);
                    lVar63 = (long)((local_90 << 0x20) * 3) >> 0x20;
                    local_120 = (long)(iVar71 * 3);
                    local_c0 = (long)((local_90 << 0x20) + 0x100000000) >> 0x20;
                    local_60 = (long)(iVar71 * 2 + 1);
                    local_48 = (long)(iVar71 * 3 + 1);
                    local_80 = (long)(iVar81 * 4) * 4;
                    uVar78 = 0;
                    pfVar68 = pfVar70;
                    do {
                      local_70 = uVar78;
                      pfVar70 = (float *)((long)(this->super_Convolution).bias_data.data +
                                         local_70 * 4 + local_a8 * 4);
                      if (pfVar68 == (float *)0x0) {
                        pfVar70 = pfVar68;
                      }
                      uVar76 = 0;
                      pfVar68 = (float *)((long)top_blob->data +
                                         local_78 * 4 + (local_70 + local_a8) * lVar73 * 4);
                      pfVar91 = local_128;
                      if (0xb < (int)uVar82) {
                        uVar60 = 0;
                        do {
                          if (iVar58 == 0) {
                            if (pfVar70 == (float *)0x0) {
                              fVar107 = 0.0;
                              fVar108 = 0.0;
                              fVar109 = 0.0;
                              fVar110 = 0.0;
                              fVar92 = 0.0;
                              fVar100 = 0.0;
                              fVar101 = 0.0;
                              fVar102 = 0.0;
                              fVar115 = 0.0;
                              fVar116 = 0.0;
                              fVar117 = 0.0;
                              fVar118 = 0.0;
                              fVar111 = 0.0;
                              fVar112 = 0.0;
                              fVar113 = 0.0;
                              fVar114 = 0.0;
                              fVar127 = 0.0;
                              fVar128 = 0.0;
                              fVar129 = 0.0;
                              fVar130 = 0.0;
                              fVar103 = 0.0;
                              fVar104 = 0.0;
                              fVar105 = 0.0;
                              fVar106 = 0.0;
                              fVar131 = 0.0;
                              fVar132 = 0.0;
                              fVar133 = 0.0;
                              fVar134 = 0.0;
                              fVar123 = 0.0;
                              fVar124 = 0.0;
                              fVar125 = 0.0;
                              fVar126 = 0.0;
                              fVar139 = 0.0;
                              fVar140 = 0.0;
                              fVar141 = 0.0;
                              fVar142 = 0.0;
                              fVar119 = 0.0;
                              fVar120 = 0.0;
                              fVar121 = 0.0;
                              fVar122 = 0.0;
                              fVar143 = 0.0;
                              fVar144 = 0.0;
                              fVar145 = 0.0;
                              fVar146 = 0.0;
                              fVar135 = 0.0;
                              fVar136 = 0.0;
                              fVar137 = 0.0;
                              fVar138 = 0.0;
                            }
                            else {
                              fVar103 = *pfVar70;
                              fVar104 = pfVar70[1];
                              fVar105 = pfVar70[2];
                              fVar106 = pfVar70[3];
                              fVar107 = fVar103;
                              fVar108 = fVar104;
                              fVar109 = fVar105;
                              fVar110 = fVar106;
                              fVar111 = fVar103;
                              fVar112 = fVar104;
                              fVar113 = fVar105;
                              fVar114 = fVar106;
                              fVar115 = fVar103;
                              fVar116 = fVar104;
                              fVar117 = fVar105;
                              fVar118 = fVar106;
                              fVar119 = fVar103;
                              fVar120 = fVar104;
                              fVar121 = fVar105;
                              fVar122 = fVar106;
                              fVar123 = fVar103;
                              fVar124 = fVar104;
                              fVar125 = fVar105;
                              fVar126 = fVar106;
                              fVar127 = fVar103;
                              fVar128 = fVar104;
                              fVar129 = fVar105;
                              fVar130 = fVar106;
                              fVar131 = fVar103;
                              fVar132 = fVar104;
                              fVar133 = fVar105;
                              fVar134 = fVar106;
                              fVar135 = fVar103;
                              fVar136 = fVar104;
                              fVar137 = fVar105;
                              fVar138 = fVar106;
                              fVar139 = fVar103;
                              fVar140 = fVar104;
                              fVar141 = fVar105;
                              fVar142 = fVar106;
                              fVar143 = fVar103;
                              fVar144 = fVar104;
                              fVar145 = fVar105;
                              fVar146 = fVar106;
                              fVar92 = fVar103;
                              fVar100 = fVar104;
                              fVar101 = fVar105;
                              fVar102 = fVar106;
                            }
                          }
                          else {
                            fVar103 = pfVar75[0x18];
                            fVar104 = pfVar75[0x19];
                            fVar105 = pfVar75[0x1a];
                            fVar106 = pfVar75[0x1b];
                            fVar107 = pfVar75[0x2c];
                            fVar108 = pfVar75[0x2d];
                            fVar109 = pfVar75[0x2e];
                            fVar110 = pfVar75[0x2f];
                            fVar111 = pfVar75[0x20];
                            fVar112 = pfVar75[0x21];
                            fVar113 = pfVar75[0x22];
                            fVar114 = pfVar75[0x23];
                            fVar115 = pfVar75[0x24];
                            fVar116 = pfVar75[0x25];
                            fVar117 = pfVar75[0x26];
                            fVar118 = pfVar75[0x27];
                            fVar119 = pfVar75[8];
                            fVar120 = pfVar75[9];
                            fVar121 = pfVar75[10];
                            fVar122 = pfVar75[0xb];
                            fVar123 = pfVar75[0x10];
                            fVar124 = pfVar75[0x11];
                            fVar125 = pfVar75[0x12];
                            fVar126 = pfVar75[0x13];
                            fVar127 = pfVar75[0x1c];
                            fVar128 = pfVar75[0x1d];
                            fVar129 = pfVar75[0x1e];
                            fVar130 = pfVar75[0x1f];
                            fVar131 = pfVar75[0x14];
                            fVar132 = pfVar75[0x15];
                            fVar133 = pfVar75[0x16];
                            fVar134 = pfVar75[0x17];
                            fVar135 = *pfVar75;
                            fVar136 = pfVar75[1];
                            fVar137 = pfVar75[2];
                            fVar138 = pfVar75[3];
                            fVar139 = pfVar75[0xc];
                            fVar140 = pfVar75[0xd];
                            fVar141 = pfVar75[0xe];
                            fVar142 = pfVar75[0xf];
                            fVar143 = pfVar75[4];
                            fVar144 = pfVar75[5];
                            fVar145 = pfVar75[6];
                            fVar146 = pfVar75[7];
                            fVar92 = pfVar75[0x28];
                            fVar100 = pfVar75[0x29];
                            fVar101 = pfVar75[0x2a];
                            fVar102 = pfVar75[0x2b];
                          }
                          pfVar66 = pfVar72;
                          iVar62 = iVar81;
                          if (0 < iVar81) {
                            do {
                              fVar50 = *pfVar66;
                              fVar51 = pfVar66[1];
                              fVar52 = pfVar66[2];
                              fVar53 = pfVar66[3];
                              fVar1 = *pfVar91;
                              fVar135 = fVar135 + fVar1 * fVar50;
                              fVar136 = fVar136 + fVar1 * fVar51;
                              fVar137 = fVar137 + fVar1 * fVar52;
                              fVar138 = fVar138 + fVar1 * fVar53;
                              fVar1 = pfVar91[1];
                              fVar143 = fVar143 + fVar1 * fVar50;
                              fVar144 = fVar144 + fVar1 * fVar51;
                              fVar145 = fVar145 + fVar1 * fVar52;
                              fVar146 = fVar146 + fVar1 * fVar53;
                              fVar1 = pfVar91[2];
                              fVar119 = fVar119 + fVar1 * fVar50;
                              fVar120 = fVar120 + fVar1 * fVar51;
                              fVar121 = fVar121 + fVar1 * fVar52;
                              fVar122 = fVar122 + fVar1 * fVar53;
                              fVar1 = pfVar91[3];
                              fVar139 = fVar139 + fVar1 * fVar50;
                              fVar140 = fVar140 + fVar1 * fVar51;
                              fVar141 = fVar141 + fVar1 * fVar52;
                              fVar142 = fVar142 + fVar1 * fVar53;
                              fVar1 = pfVar91[4];
                              fVar123 = fVar123 + fVar1 * fVar50;
                              fVar124 = fVar124 + fVar1 * fVar51;
                              fVar125 = fVar125 + fVar1 * fVar52;
                              fVar126 = fVar126 + fVar1 * fVar53;
                              fVar1 = pfVar91[5];
                              fVar131 = fVar131 + fVar1 * fVar50;
                              fVar132 = fVar132 + fVar1 * fVar51;
                              fVar133 = fVar133 + fVar1 * fVar52;
                              fVar134 = fVar134 + fVar1 * fVar53;
                              fVar1 = pfVar91[6];
                              fVar103 = fVar103 + fVar1 * fVar50;
                              fVar104 = fVar104 + fVar1 * fVar51;
                              fVar105 = fVar105 + fVar1 * fVar52;
                              fVar106 = fVar106 + fVar1 * fVar53;
                              fVar1 = pfVar91[7];
                              fVar127 = fVar127 + fVar1 * fVar50;
                              fVar128 = fVar128 + fVar1 * fVar51;
                              fVar129 = fVar129 + fVar1 * fVar52;
                              fVar130 = fVar130 + fVar1 * fVar53;
                              fVar1 = pfVar91[8];
                              fVar111 = fVar111 + fVar1 * fVar50;
                              fVar112 = fVar112 + fVar1 * fVar51;
                              fVar113 = fVar113 + fVar1 * fVar52;
                              fVar114 = fVar114 + fVar1 * fVar53;
                              fVar1 = pfVar91[9];
                              fVar115 = fVar115 + fVar1 * fVar50;
                              fVar116 = fVar116 + fVar1 * fVar51;
                              fVar117 = fVar117 + fVar1 * fVar52;
                              fVar118 = fVar118 + fVar1 * fVar53;
                              fVar1 = pfVar91[10];
                              fVar92 = fVar92 + fVar1 * fVar50;
                              fVar100 = fVar100 + fVar1 * fVar51;
                              fVar101 = fVar101 + fVar1 * fVar52;
                              fVar102 = fVar102 + fVar1 * fVar53;
                              fVar1 = pfVar91[0xb];
                              fVar107 = fVar107 + fVar1 * fVar50;
                              fVar108 = fVar108 + fVar1 * fVar51;
                              fVar109 = fVar109 + fVar1 * fVar52;
                              fVar110 = fVar110 + fVar1 * fVar53;
                              pfVar91 = pfVar91 + 0xc;
                              iVar62 = iVar62 + -1;
                              pfVar66 = pfVar66 + 4;
                            } while (iVar62 != 0);
                          }
                          if (iVar61 < iVar80) {
                            *pfVar75 = fVar135;
                            pfVar75[1] = fVar136;
                            pfVar75[2] = fVar137;
                            pfVar75[3] = fVar138;
                            pfVar75[4] = fVar143;
                            pfVar75[5] = fVar144;
                            pfVar75[6] = fVar145;
                            pfVar75[7] = fVar146;
                            pfVar75[8] = fVar119;
                            pfVar75[9] = fVar120;
                            pfVar75[10] = fVar121;
                            pfVar75[0xb] = fVar122;
                            pfVar75[0xc] = fVar139;
                            pfVar75[0xd] = fVar140;
                            pfVar75[0xe] = fVar141;
                            pfVar75[0xf] = fVar142;
                            pfVar75[0x10] = fVar123;
                            pfVar75[0x11] = fVar124;
                            pfVar75[0x12] = fVar125;
                            pfVar75[0x13] = fVar126;
                            pfVar75[0x14] = fVar131;
                            pfVar75[0x15] = fVar132;
                            pfVar75[0x16] = fVar133;
                            pfVar75[0x17] = fVar134;
                            pfVar75[0x18] = fVar103;
                            pfVar75[0x19] = fVar104;
                            pfVar75[0x1a] = fVar105;
                            pfVar75[0x1b] = fVar106;
                            pfVar75[0x1c] = fVar127;
                            pfVar75[0x1d] = fVar128;
                            pfVar75[0x1e] = fVar129;
                            pfVar75[0x1f] = fVar130;
                            pfVar75[0x20] = fVar111;
                            pfVar75[0x21] = fVar112;
                            pfVar75[0x22] = fVar113;
                            pfVar75[0x23] = fVar114;
                            pfVar75[0x24] = fVar115;
                            pfVar75[0x25] = fVar116;
                            pfVar75[0x26] = fVar117;
                            pfVar75[0x27] = fVar118;
                            pfVar75[0x28] = fVar92;
                            pfVar75[0x29] = fVar100;
                            pfVar75[0x2a] = fVar101;
                            pfVar75[0x2b] = fVar102;
                            pfVar75[0x2c] = fVar107;
                            pfVar75[0x2d] = fVar108;
                            pfVar75[0x2e] = fVar109;
                            pfVar75[0x2f] = fVar110;
                          }
                          else {
                            if (iVar85 == 4) {
                              *pfVar68 = fVar135;
                              pfVar68[1] = fVar136;
                              pfVar68[2] = fVar137;
                              pfVar68[3] = fVar138;
                              pfVar68[4] = fVar143;
                              pfVar68[5] = fVar144;
                              pfVar68[6] = fVar145;
                              pfVar68[7] = fVar146;
                              pfVar68[8] = fVar119;
                              pfVar68[9] = fVar120;
                              pfVar68[10] = fVar121;
                              pfVar68[0xb] = fVar122;
                              pfVar68[0xc] = fVar139;
                              pfVar68[0xd] = fVar140;
                              pfVar68[0xe] = fVar141;
                              pfVar68[0xf] = fVar142;
                              pfVar68[0x10] = fVar123;
                              pfVar68[0x11] = fVar124;
                              pfVar68[0x12] = fVar125;
                              pfVar68[0x13] = fVar126;
                              pfVar68[0x14] = fVar131;
                              pfVar68[0x15] = fVar132;
                              pfVar68[0x16] = fVar133;
                              pfVar68[0x17] = fVar134;
                              pfVar68[0x18] = fVar103;
                              pfVar68[0x19] = fVar104;
                              pfVar68[0x1a] = fVar105;
                              pfVar68[0x1b] = fVar106;
                              pfVar68[0x1c] = fVar127;
                              pfVar68[0x1d] = fVar128;
                              pfVar68[0x1e] = fVar129;
                              pfVar68[0x1f] = fVar130;
                              pfVar68[0x20] = fVar111;
                              pfVar68[0x21] = fVar112;
                              pfVar68[0x22] = fVar113;
                              pfVar68[0x23] = fVar114;
                              pfVar68[0x24] = fVar115;
                              pfVar68[0x25] = fVar116;
                              pfVar68[0x26] = fVar117;
                              pfVar68[0x27] = fVar118;
                              pfVar68[0x28] = fVar92;
                              pfVar68[0x29] = fVar100;
                              pfVar68[0x2a] = fVar101;
                              pfVar68[0x2b] = fVar102;
                              pfVar68[0x2c] = fVar107;
                              pfVar68[0x2d] = fVar108;
                              pfVar68[0x2e] = fVar109;
                              pfVar68[0x2f] = fVar110;
                              pfVar68 = pfVar68 + 0x30;
                            }
                            if (iVar85 == 1) {
                              *pfVar68 = fVar135;
                              pfVar68[1] = fVar143;
                              pfVar68[2] = fVar119;
                              pfVar68[3] = fVar139;
                              pfVar66 = pfVar68 + lVar73;
                              *pfVar66 = fVar136;
                              pfVar66[1] = fVar144;
                              pfVar66[2] = fVar120;
                              pfVar66[3] = fVar140;
                              pfVar66 = pfVar68 + lVar77;
                              *pfVar66 = fVar137;
                              pfVar66[1] = fVar145;
                              pfVar66[2] = fVar121;
                              pfVar66[3] = fVar141;
                              pfVar66 = pfVar68 + lVar63;
                              *pfVar66 = fVar138;
                              pfVar66[1] = fVar146;
                              pfVar66[2] = fVar122;
                              pfVar66[3] = fVar142;
                              pfVar68[4] = fVar123;
                              pfVar68[5] = fVar131;
                              pfVar68[6] = fVar103;
                              pfVar68[7] = fVar127;
                              pfVar66 = pfVar68 + lVar73 + 4;
                              *pfVar66 = fVar124;
                              pfVar66[1] = fVar132;
                              pfVar66[2] = fVar104;
                              pfVar66[3] = fVar128;
                              pfVar66 = pfVar68 + lVar77 + 4;
                              *pfVar66 = fVar125;
                              pfVar66[1] = fVar133;
                              pfVar66[2] = fVar105;
                              pfVar66[3] = fVar129;
                              pfVar66 = pfVar68 + lVar63 + 4;
                              *pfVar66 = fVar126;
                              pfVar66[1] = fVar134;
                              pfVar66[2] = fVar106;
                              pfVar66[3] = fVar130;
                              pfVar68[8] = fVar111;
                              pfVar68[9] = fVar115;
                              pfVar68[10] = fVar92;
                              pfVar68[0xb] = fVar107;
                              pfVar66 = pfVar68 + lVar73 + 8;
                              *pfVar66 = fVar112;
                              pfVar66[1] = fVar116;
                              pfVar66[2] = fVar100;
                              pfVar66[3] = fVar108;
                              pfVar66 = pfVar68 + lVar77 + 8;
                              *pfVar66 = fVar113;
                              pfVar66[1] = fVar117;
                              pfVar66[2] = fVar101;
                              pfVar66[3] = fVar109;
                              pfVar66 = pfVar68 + lVar63 + 8;
                              *pfVar66 = fVar114;
                              pfVar66[1] = fVar118;
                              pfVar66[2] = fVar102;
                              pfVar66[3] = fVar110;
                              pfVar68 = pfVar68 + 0xc;
                            }
                          }
                          pfVar75 = pfVar75 + 0x30;
                          uVar76 = uVar60 + 0xc;
                          iVar62 = uVar60 + 0x17;
                          uVar60 = uVar76;
                        } while (iVar62 < (int)uVar82);
                      }
                      iVar62 = uVar76 + 7;
                      while (iVar62 < (int)uVar82) {
                        if (iVar58 == 0) {
                          if (pfVar70 == (float *)0x0) {
                            fVar103 = 0.0;
                            fVar104 = 0.0;
                            fVar105 = 0.0;
                            fVar106 = 0.0;
                            fVar131 = 0.0;
                            fVar132 = 0.0;
                            fVar133 = 0.0;
                            fVar134 = 0.0;
                            fVar115 = 0.0;
                            fVar116 = 0.0;
                            fVar117 = 0.0;
                            fVar118 = 0.0;
                            fVar107 = 0.0;
                            fVar108 = 0.0;
                            fVar109 = 0.0;
                            fVar110 = 0.0;
                            fVar123 = 0.0;
                            fVar124 = 0.0;
                            fVar125 = 0.0;
                            fVar126 = 0.0;
                            fVar111 = 0.0;
                            fVar112 = 0.0;
                            fVar113 = 0.0;
                            fVar114 = 0.0;
                            fVar127 = 0.0;
                            fVar128 = 0.0;
                            fVar129 = 0.0;
                            fVar130 = 0.0;
                            fVar119 = 0.0;
                            fVar120 = 0.0;
                            fVar121 = 0.0;
                            fVar122 = 0.0;
                          }
                          else {
                            fVar103 = *pfVar70;
                            fVar104 = pfVar70[1];
                            fVar105 = pfVar70[2];
                            fVar106 = pfVar70[3];
                            fVar107 = fVar103;
                            fVar108 = fVar104;
                            fVar109 = fVar105;
                            fVar110 = fVar106;
                            fVar111 = fVar103;
                            fVar112 = fVar104;
                            fVar113 = fVar105;
                            fVar114 = fVar106;
                            fVar115 = fVar103;
                            fVar116 = fVar104;
                            fVar117 = fVar105;
                            fVar118 = fVar106;
                            fVar119 = fVar103;
                            fVar120 = fVar104;
                            fVar121 = fVar105;
                            fVar122 = fVar106;
                            fVar123 = fVar103;
                            fVar124 = fVar104;
                            fVar125 = fVar105;
                            fVar126 = fVar106;
                            fVar127 = fVar103;
                            fVar128 = fVar104;
                            fVar129 = fVar105;
                            fVar130 = fVar106;
                            fVar131 = fVar103;
                            fVar132 = fVar104;
                            fVar133 = fVar105;
                            fVar134 = fVar106;
                          }
                        }
                        else {
                          fVar103 = pfVar75[0x1c];
                          fVar104 = pfVar75[0x1d];
                          fVar105 = pfVar75[0x1e];
                          fVar106 = pfVar75[0x1f];
                          fVar107 = pfVar75[0x10];
                          fVar108 = pfVar75[0x11];
                          fVar109 = pfVar75[0x12];
                          fVar110 = pfVar75[0x13];
                          fVar111 = pfVar75[8];
                          fVar112 = pfVar75[9];
                          fVar113 = pfVar75[10];
                          fVar114 = pfVar75[0xb];
                          fVar115 = pfVar75[0x14];
                          fVar116 = pfVar75[0x15];
                          fVar117 = pfVar75[0x16];
                          fVar118 = pfVar75[0x17];
                          fVar119 = *pfVar75;
                          fVar120 = pfVar75[1];
                          fVar121 = pfVar75[2];
                          fVar122 = pfVar75[3];
                          fVar123 = pfVar75[0xc];
                          fVar124 = pfVar75[0xd];
                          fVar125 = pfVar75[0xe];
                          fVar126 = pfVar75[0xf];
                          fVar127 = pfVar75[4];
                          fVar128 = pfVar75[5];
                          fVar129 = pfVar75[6];
                          fVar130 = pfVar75[7];
                          fVar131 = pfVar75[0x18];
                          fVar132 = pfVar75[0x19];
                          fVar133 = pfVar75[0x1a];
                          fVar134 = pfVar75[0x1b];
                        }
                        pfVar66 = pfVar72;
                        iVar62 = iVar81;
                        if (0 < iVar81) {
                          do {
                            fVar139 = *pfVar66;
                            fVar140 = pfVar66[1];
                            fVar141 = pfVar66[2];
                            fVar142 = pfVar66[3];
                            fVar135 = *pfVar91;
                            fVar136 = pfVar91[1];
                            fVar137 = pfVar91[2];
                            fVar138 = pfVar91[3];
                            fVar119 = fVar119 + fVar135 * fVar139;
                            fVar120 = fVar120 + fVar135 * fVar140;
                            fVar121 = fVar121 + fVar135 * fVar141;
                            fVar122 = fVar122 + fVar135 * fVar142;
                            fVar127 = fVar127 + fVar136 * fVar139;
                            fVar128 = fVar128 + fVar136 * fVar140;
                            fVar129 = fVar129 + fVar136 * fVar141;
                            fVar130 = fVar130 + fVar136 * fVar142;
                            fVar111 = fVar111 + fVar137 * fVar139;
                            fVar112 = fVar112 + fVar137 * fVar140;
                            fVar113 = fVar113 + fVar137 * fVar141;
                            fVar114 = fVar114 + fVar137 * fVar142;
                            fVar123 = fVar123 + fVar138 * fVar139;
                            fVar124 = fVar124 + fVar138 * fVar140;
                            fVar125 = fVar125 + fVar138 * fVar141;
                            fVar126 = fVar126 + fVar138 * fVar142;
                            fVar135 = pfVar91[4];
                            fVar107 = fVar107 + fVar135 * fVar139;
                            fVar108 = fVar108 + fVar135 * fVar140;
                            fVar109 = fVar109 + fVar135 * fVar141;
                            fVar110 = fVar110 + fVar135 * fVar142;
                            fVar135 = pfVar91[5];
                            fVar115 = fVar115 + fVar135 * fVar139;
                            fVar116 = fVar116 + fVar135 * fVar140;
                            fVar117 = fVar117 + fVar135 * fVar141;
                            fVar118 = fVar118 + fVar135 * fVar142;
                            fVar135 = pfVar91[6];
                            fVar131 = fVar131 + fVar135 * fVar139;
                            fVar132 = fVar132 + fVar135 * fVar140;
                            fVar133 = fVar133 + fVar135 * fVar141;
                            fVar134 = fVar134 + fVar135 * fVar142;
                            fVar135 = pfVar91[7];
                            fVar103 = fVar103 + fVar135 * fVar139;
                            fVar104 = fVar104 + fVar135 * fVar140;
                            fVar105 = fVar105 + fVar135 * fVar141;
                            fVar106 = fVar106 + fVar135 * fVar142;
                            pfVar91 = pfVar91 + 8;
                            iVar62 = iVar62 + -1;
                            pfVar66 = pfVar66 + 4;
                          } while (iVar62 != 0);
                        }
                        if (iVar61 < iVar80) {
                          *pfVar75 = fVar119;
                          pfVar75[1] = fVar120;
                          pfVar75[2] = fVar121;
                          pfVar75[3] = fVar122;
                          pfVar75[4] = fVar127;
                          pfVar75[5] = fVar128;
                          pfVar75[6] = fVar129;
                          pfVar75[7] = fVar130;
                          pfVar75[8] = fVar111;
                          pfVar75[9] = fVar112;
                          pfVar75[10] = fVar113;
                          pfVar75[0xb] = fVar114;
                          pfVar75[0xc] = fVar123;
                          pfVar75[0xd] = fVar124;
                          pfVar75[0xe] = fVar125;
                          pfVar75[0xf] = fVar126;
                          pfVar75[0x10] = fVar107;
                          pfVar75[0x11] = fVar108;
                          pfVar75[0x12] = fVar109;
                          pfVar75[0x13] = fVar110;
                          pfVar75[0x14] = fVar115;
                          pfVar75[0x15] = fVar116;
                          pfVar75[0x16] = fVar117;
                          pfVar75[0x17] = fVar118;
                          pfVar75[0x18] = fVar131;
                          pfVar75[0x19] = fVar132;
                          pfVar75[0x1a] = fVar133;
                          pfVar75[0x1b] = fVar134;
                          pfVar75[0x1c] = fVar103;
                          pfVar75[0x1d] = fVar104;
                          pfVar75[0x1e] = fVar105;
                          pfVar75[0x1f] = fVar106;
                        }
                        else {
                          if (iVar85 == 4) {
                            *pfVar68 = fVar119;
                            pfVar68[1] = fVar120;
                            pfVar68[2] = fVar121;
                            pfVar68[3] = fVar122;
                            pfVar68[4] = fVar127;
                            pfVar68[5] = fVar128;
                            pfVar68[6] = fVar129;
                            pfVar68[7] = fVar130;
                            pfVar68[8] = fVar111;
                            pfVar68[9] = fVar112;
                            pfVar68[10] = fVar113;
                            pfVar68[0xb] = fVar114;
                            pfVar68[0xc] = fVar123;
                            pfVar68[0xd] = fVar124;
                            pfVar68[0xe] = fVar125;
                            pfVar68[0xf] = fVar126;
                            pfVar68[0x10] = fVar107;
                            pfVar68[0x11] = fVar108;
                            pfVar68[0x12] = fVar109;
                            pfVar68[0x13] = fVar110;
                            pfVar68[0x14] = fVar115;
                            pfVar68[0x15] = fVar116;
                            pfVar68[0x16] = fVar117;
                            pfVar68[0x17] = fVar118;
                            pfVar68[0x18] = fVar131;
                            pfVar68[0x19] = fVar132;
                            pfVar68[0x1a] = fVar133;
                            pfVar68[0x1b] = fVar134;
                            pfVar68[0x1c] = fVar103;
                            pfVar68[0x1d] = fVar104;
                            pfVar68[0x1e] = fVar105;
                            pfVar68[0x1f] = fVar106;
                            pfVar68 = pfVar68 + 0x20;
                          }
                          if (iVar85 == 1) {
                            *pfVar68 = fVar119;
                            pfVar68[1] = fVar127;
                            pfVar68[2] = fVar111;
                            pfVar68[3] = fVar123;
                            pfVar66 = pfVar68 + lVar73;
                            *pfVar66 = fVar120;
                            pfVar66[1] = fVar128;
                            pfVar66[2] = fVar112;
                            pfVar66[3] = fVar124;
                            pfVar66 = pfVar68 + lVar77;
                            *pfVar66 = fVar121;
                            pfVar66[1] = fVar129;
                            pfVar66[2] = fVar113;
                            pfVar66[3] = fVar125;
                            pfVar66 = pfVar68 + lVar63;
                            *pfVar66 = fVar122;
                            pfVar66[1] = fVar130;
                            pfVar66[2] = fVar114;
                            pfVar66[3] = fVar126;
                            pfVar68[4] = fVar107;
                            pfVar68[5] = fVar115;
                            pfVar68[6] = fVar131;
                            pfVar68[7] = fVar103;
                            pfVar66 = pfVar68 + lVar73 + 4;
                            *pfVar66 = fVar108;
                            pfVar66[1] = fVar116;
                            pfVar66[2] = fVar132;
                            pfVar66[3] = fVar104;
                            pfVar66 = pfVar68 + lVar77 + 4;
                            *pfVar66 = fVar109;
                            pfVar66[1] = fVar117;
                            pfVar66[2] = fVar133;
                            pfVar66[3] = fVar105;
                            pfVar66 = pfVar68 + lVar63 + 4;
                            *pfVar66 = fVar110;
                            pfVar66[1] = fVar118;
                            pfVar66[2] = fVar134;
                            pfVar66[3] = fVar106;
                            pfVar68 = pfVar68 + 8;
                          }
                        }
                        pfVar75 = pfVar75 + 0x20;
                        iVar62 = uVar76 + 0xf;
                        uVar76 = uVar76 + 8;
                      }
                      uVar60 = uVar76 | 3;
                      while ((int)uVar60 < (int)uVar82) {
                        if (iVar58 == 0) {
                          if (pfVar70 == (float *)0x0) {
                            fVar103 = 0.0;
                            fVar104 = 0.0;
                            fVar105 = 0.0;
                            fVar106 = 0.0;
                            fVar115 = 0.0;
                            fVar116 = 0.0;
                            fVar117 = 0.0;
                            fVar118 = 0.0;
                            fVar111 = 0.0;
                            fVar112 = 0.0;
                            fVar113 = 0.0;
                            fVar114 = 0.0;
                            fVar107 = 0.0;
                            fVar108 = 0.0;
                            fVar109 = 0.0;
                            fVar110 = 0.0;
                          }
                          else {
                            fVar103 = *pfVar70;
                            fVar104 = pfVar70[1];
                            fVar105 = pfVar70[2];
                            fVar106 = pfVar70[3];
                            fVar107 = fVar103;
                            fVar108 = fVar104;
                            fVar109 = fVar105;
                            fVar110 = fVar106;
                            fVar111 = fVar103;
                            fVar112 = fVar104;
                            fVar113 = fVar105;
                            fVar114 = fVar106;
                            fVar115 = fVar103;
                            fVar116 = fVar104;
                            fVar117 = fVar105;
                            fVar118 = fVar106;
                          }
                        }
                        else {
                          fVar103 = pfVar75[0xc];
                          fVar104 = pfVar75[0xd];
                          fVar105 = pfVar75[0xe];
                          fVar106 = pfVar75[0xf];
                          fVar107 = *pfVar75;
                          fVar108 = pfVar75[1];
                          fVar109 = pfVar75[2];
                          fVar110 = pfVar75[3];
                          fVar111 = pfVar75[4];
                          fVar112 = pfVar75[5];
                          fVar113 = pfVar75[6];
                          fVar114 = pfVar75[7];
                          fVar115 = pfVar75[8];
                          fVar116 = pfVar75[9];
                          fVar117 = pfVar75[10];
                          fVar118 = pfVar75[0xb];
                        }
                        if (0 < iVar81) {
                          lVar83 = 0;
                          iVar62 = iVar81;
                          do {
                            pfVar66 = (float *)((long)pfVar72 + lVar83);
                            fVar123 = *pfVar66;
                            fVar124 = pfVar66[1];
                            fVar125 = pfVar66[2];
                            fVar126 = pfVar66[3];
                            fVar119 = *(float *)((long)pfVar91 + lVar83);
                            fVar120 = *(float *)((long)pfVar91 + lVar83 + 4);
                            fVar121 = *(float *)((long)pfVar91 + lVar83 + 8);
                            fVar122 = *(float *)((long)pfVar91 + lVar83 + 0xc);
                            fVar107 = fVar107 + fVar119 * fVar123;
                            fVar108 = fVar108 + fVar119 * fVar124;
                            fVar109 = fVar109 + fVar119 * fVar125;
                            fVar110 = fVar110 + fVar119 * fVar126;
                            fVar111 = fVar111 + fVar120 * fVar123;
                            fVar112 = fVar112 + fVar120 * fVar124;
                            fVar113 = fVar113 + fVar120 * fVar125;
                            fVar114 = fVar114 + fVar120 * fVar126;
                            fVar115 = fVar115 + fVar121 * fVar123;
                            fVar116 = fVar116 + fVar121 * fVar124;
                            fVar117 = fVar117 + fVar121 * fVar125;
                            fVar118 = fVar118 + fVar121 * fVar126;
                            fVar103 = fVar103 + fVar122 * fVar123;
                            fVar104 = fVar104 + fVar122 * fVar124;
                            fVar105 = fVar105 + fVar122 * fVar125;
                            fVar106 = fVar106 + fVar122 * fVar126;
                            lVar83 = lVar83 + 0x10;
                            iVar62 = iVar62 + -1;
                          } while (iVar62 != 0);
                          pfVar91 = (float *)((long)pfVar91 + lVar83);
                        }
                        if (iVar61 < iVar80) {
                          *pfVar75 = fVar107;
                          pfVar75[1] = fVar108;
                          pfVar75[2] = fVar109;
                          pfVar75[3] = fVar110;
                          pfVar75[4] = fVar111;
                          pfVar75[5] = fVar112;
                          pfVar75[6] = fVar113;
                          pfVar75[7] = fVar114;
                          pfVar75[8] = fVar115;
                          pfVar75[9] = fVar116;
                          pfVar75[10] = fVar117;
                          pfVar75[0xb] = fVar118;
                          pfVar75[0xc] = fVar103;
                          pfVar75[0xd] = fVar104;
                          pfVar75[0xe] = fVar105;
                          pfVar75[0xf] = fVar106;
                        }
                        else {
                          if (iVar85 == 4) {
                            *pfVar68 = fVar107;
                            pfVar68[1] = fVar108;
                            pfVar68[2] = fVar109;
                            pfVar68[3] = fVar110;
                            pfVar68[4] = fVar111;
                            pfVar68[5] = fVar112;
                            pfVar68[6] = fVar113;
                            pfVar68[7] = fVar114;
                            pfVar68[8] = fVar115;
                            pfVar68[9] = fVar116;
                            pfVar68[10] = fVar117;
                            pfVar68[0xb] = fVar118;
                            pfVar68[0xc] = fVar103;
                            pfVar68[0xd] = fVar104;
                            pfVar68[0xe] = fVar105;
                            pfVar68[0xf] = fVar106;
                            pfVar68 = pfVar68 + 0x10;
                          }
                          if (iVar85 == 1) {
                            *pfVar68 = fVar107;
                            pfVar68[1] = fVar111;
                            pfVar68[2] = fVar115;
                            pfVar68[3] = fVar103;
                            pfVar66 = pfVar68 + lVar73;
                            *pfVar66 = fVar108;
                            pfVar66[1] = fVar112;
                            pfVar66[2] = fVar116;
                            pfVar66[3] = fVar104;
                            pfVar66 = pfVar68 + lVar77;
                            *pfVar66 = fVar109;
                            pfVar66[1] = fVar113;
                            pfVar66[2] = fVar117;
                            pfVar66[3] = fVar105;
                            pfVar66 = pfVar68 + lVar63;
                            *pfVar66 = fVar110;
                            pfVar66[1] = fVar114;
                            pfVar66[2] = fVar118;
                            pfVar66[3] = fVar106;
                            pfVar68 = pfVar68 + 4;
                          }
                        }
                        pfVar75 = pfVar75 + 0x10;
                        uVar60 = uVar76 + 7;
                        uVar76 = uVar76 + 4;
                      }
                      uVar60 = uVar76 | 1;
                      while ((int)uVar60 < (int)uVar82) {
                        if (iVar58 == 0) {
                          if (pfVar70 == (float *)0x0) {
                            fVar107 = 0.0;
                            fVar108 = 0.0;
                            fVar109 = 0.0;
                            fVar110 = 0.0;
                            fVar103 = 0.0;
                            fVar104 = 0.0;
                            fVar105 = 0.0;
                            fVar106 = 0.0;
                          }
                          else {
                            fVar103 = *pfVar70;
                            fVar104 = pfVar70[1];
                            fVar105 = pfVar70[2];
                            fVar106 = pfVar70[3];
                            fVar107 = fVar103;
                            fVar108 = fVar104;
                            fVar109 = fVar105;
                            fVar110 = fVar106;
                          }
                        }
                        else {
                          fVar103 = *pfVar75;
                          fVar104 = pfVar75[1];
                          fVar105 = pfVar75[2];
                          fVar106 = pfVar75[3];
                          fVar107 = pfVar75[4];
                          fVar108 = pfVar75[5];
                          fVar109 = pfVar75[6];
                          fVar110 = pfVar75[7];
                        }
                        if (0 < iVar81) {
                          lVar83 = 0;
                          iVar62 = iVar81;
                          do {
                            pfVar66 = (float *)((long)pfVar72 + lVar83 * 2);
                            fVar111 = *(float *)((long)pfVar91 + lVar83);
                            fVar112 = *(float *)((long)pfVar91 + lVar83 + 4);
                            fVar103 = fVar103 + fVar111 * *pfVar66;
                            fVar104 = fVar104 + fVar111 * pfVar66[1];
                            fVar105 = fVar105 + fVar111 * pfVar66[2];
                            fVar106 = fVar106 + fVar111 * pfVar66[3];
                            fVar107 = fVar107 + fVar112 * *pfVar66;
                            fVar108 = fVar108 + fVar112 * pfVar66[1];
                            fVar109 = fVar109 + fVar112 * pfVar66[2];
                            fVar110 = fVar110 + fVar112 * pfVar66[3];
                            lVar83 = lVar83 + 8;
                            iVar62 = iVar62 + -1;
                          } while (iVar62 != 0);
                          pfVar91 = (float *)((long)pfVar91 + lVar83);
                        }
                        if (iVar61 < iVar80) {
                          *pfVar75 = fVar103;
                          pfVar75[1] = fVar104;
                          pfVar75[2] = fVar105;
                          pfVar75[3] = fVar106;
                          pfVar75[4] = fVar107;
                          pfVar75[5] = fVar108;
                          pfVar75[6] = fVar109;
                          pfVar75[7] = fVar110;
                        }
                        else {
                          if (iVar85 == 4) {
                            *pfVar68 = fVar103;
                            pfVar68[1] = fVar104;
                            pfVar68[2] = fVar105;
                            pfVar68[3] = fVar106;
                            pfVar68[4] = fVar107;
                            pfVar68[5] = fVar108;
                            pfVar68[6] = fVar109;
                            pfVar68[7] = fVar110;
                            pfVar68 = pfVar68 + 8;
                          }
                          if (iVar85 == 1) {
                            *pfVar68 = fVar103;
                            pfVar68[lVar73] = fVar104;
                            pfVar68[lVar77] = fVar105;
                            pfVar68[local_120] = fVar106;
                            pfVar68[1] = fVar107;
                            pfVar68[local_c0] = fVar108;
                            pfVar68[local_60] = fVar109;
                            pfVar68[local_48] = fVar110;
                            pfVar68 = pfVar68 + 2;
                          }
                        }
                        pfVar75 = pfVar75 + 8;
                        uVar60 = uVar76 + 3;
                        uVar76 = uVar76 + 2;
                      }
                      if ((int)uVar76 < (int)uVar82) {
                        do {
                          if (iVar58 == 0) {
                            if (pfVar70 == (float *)0x0) {
                              fVar103 = 0.0;
                              fVar104 = 0.0;
                              fVar105 = 0.0;
                              fVar106 = 0.0;
                            }
                            else {
                              fVar103 = *pfVar70;
                              fVar104 = pfVar70[1];
                              fVar105 = pfVar70[2];
                              fVar106 = pfVar70[3];
                            }
                          }
                          else {
                            fVar103 = *pfVar75;
                            fVar104 = pfVar75[1];
                            fVar105 = pfVar75[2];
                            fVar106 = pfVar75[3];
                          }
                          if (0 < iVar81) {
                            lVar83 = 0;
                            iVar62 = iVar81;
                            do {
                              pfVar66 = pfVar72 + lVar83;
                              fVar107 = *(float *)((long)pfVar91 + lVar83);
                              fVar103 = fVar103 + fVar107 * *pfVar66;
                              fVar104 = fVar104 + fVar107 * pfVar66[1];
                              fVar105 = fVar105 + fVar107 * pfVar66[2];
                              fVar106 = fVar106 + fVar107 * pfVar66[3];
                              lVar83 = lVar83 + 4;
                              iVar62 = iVar62 + -1;
                            } while (iVar62 != 0);
                            pfVar91 = (float *)((long)pfVar91 + lVar83);
                          }
                          if (iVar61 < iVar80) {
                            *pfVar75 = fVar103;
                            pfVar75[1] = fVar104;
                            pfVar75[2] = fVar105;
                            pfVar75[3] = fVar106;
                          }
                          else {
                            if (iVar85 == 4) {
                              *pfVar68 = fVar103;
                              pfVar68[1] = fVar104;
                              pfVar68[2] = fVar105;
                              pfVar68[3] = fVar106;
                              pfVar68 = pfVar68 + 4;
                            }
                            if (iVar85 == 1) {
                              *pfVar68 = fVar103;
                              pfVar68[lVar73] = fVar104;
                              pfVar68[lVar77] = fVar105;
                              pfVar68[lVar63] = fVar106;
                              pfVar68 = pfVar68 + 1;
                            }
                          }
                          pfVar75 = pfVar75 + 4;
                          uVar76 = uVar76 + 1;
                        } while (uVar76 != uVar82);
                      }
                      pfVar72 = pfVar72 + iVar81 * 4;
                      uVar78 = local_70 + 4;
                      pfVar68 = pfVar70;
                      local_38 = lVar86;
                    } while (local_70 + 7 < local_b0);
                  }
                  if ((int)((uint)uVar78 | 1) < (int)uVar65) {
                    lVar73 = (long)iVar71;
                    lVar63 = (long)iVar84;
                    if (lVar86 < lVar63) {
                      iVar84 = TILE_K;
                    }
                    local_120 = (long)(iVar81 * 2) * 4;
                    pfVar68 = pfVar70;
                    uVar74 = uVar78 & 0xffffffff;
                    if (lVar86 < lVar63) {
                      lVar63 = lVar86;
                    }
                    do {
                      local_c0 = uVar74;
                      pfVar70 = (float *)((long)(this->super_Convolution).bias_data.data +
                                         local_c0 * 4 + local_a8 * 4);
                      if (pfVar68 == (float *)0x0) {
                        pfVar70 = pfVar68;
                      }
                      uVar76 = 0;
                      pfVar68 = (float *)((long)top_blob->data +
                                         local_68 * 4 + (local_c0 + local_a8) * lVar73 * 4);
                      pfVar91 = local_128;
                      if (0xb < (int)uVar82) {
                        uVar60 = 0;
                        do {
                          if (iVar58 == 0) {
                            if (pfVar70 == (float *)0x0) {
                              fVar123 = 0.0;
                              fVar124 = 0.0;
                              fVar125 = 0.0;
                              fVar126 = 0.0;
                              fVar103 = 0.0;
                              fVar108 = 0.0;
                              fVar109 = 0.0;
                              fVar110 = 0.0;
                              fVar111 = 0.0;
                              fVar112 = 0.0;
                              fVar113 = 0.0;
                              fVar114 = 0.0;
                              fVar104 = 0.0;
                              fVar105 = 0.0;
                              fVar106 = 0.0;
                              fVar107 = 0.0;
                              fVar119 = 0.0;
                              fVar120 = 0.0;
                              fVar121 = 0.0;
                              fVar122 = 0.0;
                              fVar115 = 0.0;
                              fVar116 = 0.0;
                              fVar117 = 0.0;
                              fVar118 = 0.0;
                            }
                            else {
                              fVar103 = *pfVar70;
                              fVar104 = pfVar70[1];
                              fVar105 = fVar104;
                              fVar106 = fVar104;
                              fVar107 = fVar104;
                              fVar108 = fVar103;
                              fVar109 = fVar103;
                              fVar110 = fVar103;
                              fVar111 = fVar103;
                              fVar112 = fVar103;
                              fVar113 = fVar103;
                              fVar114 = fVar103;
                              fVar115 = fVar104;
                              fVar116 = fVar104;
                              fVar117 = fVar104;
                              fVar118 = fVar104;
                              fVar119 = fVar104;
                              fVar120 = fVar104;
                              fVar121 = fVar104;
                              fVar122 = fVar104;
                              fVar123 = fVar103;
                              fVar124 = fVar103;
                              fVar125 = fVar103;
                              fVar126 = fVar103;
                            }
                          }
                          else {
                            fVar104 = pfVar75[1];
                            fVar103 = pfVar75[8];
                            fVar105 = pfVar75[3];
                            fVar106 = pfVar75[5];
                            fVar107 = pfVar75[7];
                            fVar108 = pfVar75[10];
                            fVar109 = pfVar75[0xc];
                            fVar110 = pfVar75[0xe];
                            fVar111 = pfVar75[0x10];
                            fVar112 = pfVar75[0x12];
                            fVar113 = pfVar75[0x14];
                            fVar114 = pfVar75[0x16];
                            fVar115 = pfVar75[0x11];
                            fVar116 = pfVar75[0x13];
                            fVar117 = pfVar75[0x15];
                            fVar118 = pfVar75[0x17];
                            fVar119 = pfVar75[9];
                            fVar120 = pfVar75[0xb];
                            fVar121 = pfVar75[0xd];
                            fVar122 = pfVar75[0xf];
                            fVar123 = *pfVar75;
                            fVar124 = pfVar75[2];
                            fVar125 = pfVar75[4];
                            fVar126 = pfVar75[6];
                          }
                          if (0 < iVar81) {
                            lVar86 = 0;
                            do {
                              fVar127 = pfVar72[lVar86 * 2];
                              fVar128 = pfVar72[lVar86 * 2 + 1];
                              fVar123 = fVar123 + fVar127 * *pfVar91;
                              fVar124 = fVar124 + fVar127 * pfVar91[1];
                              fVar125 = fVar125 + fVar127 * pfVar91[2];
                              fVar126 = fVar126 + fVar127 * pfVar91[3];
                              fVar103 = fVar103 + fVar127 * pfVar91[4];
                              fVar108 = fVar108 + fVar127 * pfVar91[5];
                              fVar109 = fVar109 + fVar127 * pfVar91[6];
                              fVar110 = fVar110 + fVar127 * pfVar91[7];
                              fVar111 = fVar111 + fVar127 * pfVar91[8];
                              fVar112 = fVar112 + fVar127 * pfVar91[9];
                              fVar113 = fVar113 + fVar127 * pfVar91[10];
                              fVar114 = fVar114 + fVar127 * pfVar91[0xb];
                              fVar104 = fVar104 + *pfVar91 * fVar128;
                              fVar105 = fVar105 + pfVar91[1] * fVar128;
                              fVar106 = fVar106 + pfVar91[2] * fVar128;
                              fVar107 = fVar107 + pfVar91[3] * fVar128;
                              fVar119 = fVar119 + pfVar91[4] * fVar128;
                              fVar120 = fVar120 + pfVar91[5] * fVar128;
                              fVar121 = fVar121 + pfVar91[6] * fVar128;
                              fVar122 = fVar122 + pfVar91[7] * fVar128;
                              fVar115 = fVar115 + fVar128 * pfVar91[8];
                              fVar116 = fVar116 + fVar128 * pfVar91[9];
                              fVar117 = fVar117 + fVar128 * pfVar91[10];
                              fVar118 = fVar118 + fVar128 * pfVar91[0xb];
                              pfVar91 = pfVar91 + 0xc;
                              lVar86 = lVar86 + 1;
                            } while (iVar84 != (int)lVar86);
                          }
                          if (iVar61 < iVar80) {
                            *pfVar75 = fVar123;
                            pfVar75[1] = fVar104;
                            pfVar75[2] = fVar124;
                            pfVar75[3] = fVar105;
                            pfVar75[4] = fVar125;
                            pfVar75[5] = fVar106;
                            pfVar75[6] = fVar126;
                            pfVar75[7] = fVar107;
                            pfVar75[8] = fVar103;
                            pfVar75[9] = fVar119;
                            pfVar75[10] = fVar108;
                            pfVar75[0xb] = fVar120;
                            pfVar75[0xc] = fVar109;
                            pfVar75[0xd] = fVar121;
                            pfVar75[0xe] = fVar110;
                            pfVar75[0xf] = fVar122;
                            pfVar75[0x10] = fVar111;
                            pfVar75[0x11] = fVar115;
                            pfVar75[0x12] = fVar112;
                            pfVar75[0x13] = fVar116;
                            pfVar75[0x14] = fVar113;
                            pfVar75[0x15] = fVar117;
                            pfVar75[0x16] = fVar114;
                            pfVar75[0x17] = fVar118;
                          }
                          else {
                            *pfVar68 = fVar123;
                            pfVar68[1] = fVar124;
                            pfVar68[2] = fVar125;
                            pfVar68[3] = fVar126;
                            pfVar68[4] = fVar103;
                            pfVar68[5] = fVar108;
                            pfVar68[6] = fVar109;
                            pfVar68[7] = fVar110;
                            pfVar68[8] = fVar111;
                            pfVar68[9] = fVar112;
                            pfVar68[10] = fVar113;
                            pfVar68[0xb] = fVar114;
                            pfVar66 = pfVar68 + lVar73;
                            *pfVar66 = fVar104;
                            pfVar66[1] = fVar105;
                            pfVar66[2] = fVar106;
                            pfVar66[3] = fVar107;
                            pfVar66 = pfVar68 + lVar73 + 4;
                            *pfVar66 = fVar119;
                            pfVar66[1] = fVar120;
                            pfVar66[2] = fVar121;
                            pfVar66[3] = fVar122;
                            pfVar66 = pfVar68 + lVar73 + 8;
                            *pfVar66 = fVar115;
                            pfVar66[1] = fVar116;
                            pfVar66[2] = fVar117;
                            pfVar66[3] = fVar118;
                            pfVar68 = pfVar68 + 0xc;
                          }
                          pfVar75 = pfVar75 + 0x18;
                          uVar76 = uVar60 + 0xc;
                          iVar85 = uVar60 + 0x17;
                          uVar60 = uVar76;
                        } while (iVar85 < (int)uVar82);
                      }
                      iVar85 = uVar76 + 7;
                      while (iVar85 < (int)uVar82) {
                        if (iVar58 == 0) {
                          if (pfVar70 == (float *)0x0) {
                            fVar115 = 0.0;
                            fVar116 = 0.0;
                            fVar117 = 0.0;
                            fVar118 = 0.0;
                            fVar103 = 0.0;
                            fVar108 = 0.0;
                            fVar109 = 0.0;
                            fVar110 = 0.0;
                            fVar104 = 0.0;
                            fVar105 = 0.0;
                            fVar106 = 0.0;
                            fVar107 = 0.0;
                            fVar111 = 0.0;
                            fVar112 = 0.0;
                            fVar113 = 0.0;
                            fVar114 = 0.0;
                          }
                          else {
                            fVar103 = *pfVar70;
                            fVar104 = pfVar70[1];
                            fVar105 = fVar104;
                            fVar106 = fVar104;
                            fVar107 = fVar104;
                            fVar108 = fVar103;
                            fVar109 = fVar103;
                            fVar110 = fVar103;
                            fVar111 = fVar104;
                            fVar112 = fVar104;
                            fVar113 = fVar104;
                            fVar114 = fVar104;
                            fVar115 = fVar103;
                            fVar116 = fVar103;
                            fVar117 = fVar103;
                            fVar118 = fVar103;
                          }
                        }
                        else {
                          fVar104 = pfVar75[1];
                          fVar103 = pfVar75[8];
                          fVar105 = pfVar75[3];
                          fVar106 = pfVar75[5];
                          fVar107 = pfVar75[7];
                          fVar108 = pfVar75[10];
                          fVar109 = pfVar75[0xc];
                          fVar110 = pfVar75[0xe];
                          fVar111 = pfVar75[9];
                          fVar112 = pfVar75[0xb];
                          fVar113 = pfVar75[0xd];
                          fVar114 = pfVar75[0xf];
                          fVar115 = *pfVar75;
                          fVar116 = pfVar75[2];
                          fVar117 = pfVar75[4];
                          fVar118 = pfVar75[6];
                        }
                        if (0 < iVar81) {
                          lVar86 = 0;
                          do {
                            fVar119 = pfVar72[lVar86 * 2];
                            fVar120 = pfVar72[lVar86 * 2 + 1];
                            fVar115 = fVar115 + fVar119 * *pfVar91;
                            fVar116 = fVar116 + fVar119 * pfVar91[1];
                            fVar117 = fVar117 + fVar119 * pfVar91[2];
                            fVar118 = fVar118 + fVar119 * pfVar91[3];
                            fVar103 = fVar103 + fVar119 * pfVar91[4];
                            fVar108 = fVar108 + fVar119 * pfVar91[5];
                            fVar109 = fVar109 + fVar119 * pfVar91[6];
                            fVar110 = fVar110 + fVar119 * pfVar91[7];
                            fVar104 = fVar104 + *pfVar91 * fVar120;
                            fVar105 = fVar105 + pfVar91[1] * fVar120;
                            fVar106 = fVar106 + pfVar91[2] * fVar120;
                            fVar107 = fVar107 + pfVar91[3] * fVar120;
                            fVar111 = fVar111 + fVar120 * pfVar91[4];
                            fVar112 = fVar112 + fVar120 * pfVar91[5];
                            fVar113 = fVar113 + fVar120 * pfVar91[6];
                            fVar114 = fVar114 + fVar120 * pfVar91[7];
                            pfVar91 = pfVar91 + 8;
                            lVar86 = lVar86 + 1;
                          } while ((int)lVar63 != (int)lVar86);
                        }
                        if (iVar61 < iVar80) {
                          *pfVar75 = fVar115;
                          pfVar75[1] = fVar104;
                          pfVar75[2] = fVar116;
                          pfVar75[3] = fVar105;
                          pfVar75[4] = fVar117;
                          pfVar75[5] = fVar106;
                          pfVar75[6] = fVar118;
                          pfVar75[7] = fVar107;
                          pfVar75[8] = fVar103;
                          pfVar75[9] = fVar111;
                          pfVar75[10] = fVar108;
                          pfVar75[0xb] = fVar112;
                          pfVar75[0xc] = fVar109;
                          pfVar75[0xd] = fVar113;
                          pfVar75[0xe] = fVar110;
                          pfVar75[0xf] = fVar114;
                        }
                        else {
                          *pfVar68 = fVar115;
                          pfVar68[1] = fVar116;
                          pfVar68[2] = fVar117;
                          pfVar68[3] = fVar118;
                          pfVar68[4] = fVar103;
                          pfVar68[5] = fVar108;
                          pfVar68[6] = fVar109;
                          pfVar68[7] = fVar110;
                          pfVar66 = pfVar68 + lVar73;
                          *pfVar66 = fVar104;
                          pfVar66[1] = fVar105;
                          pfVar66[2] = fVar106;
                          pfVar66[3] = fVar107;
                          pfVar66 = pfVar68 + lVar73 + 4;
                          *pfVar66 = fVar111;
                          pfVar66[1] = fVar112;
                          pfVar66[2] = fVar113;
                          pfVar66[3] = fVar114;
                          pfVar68 = pfVar68 + 8;
                        }
                        pfVar75 = pfVar75 + 0x10;
                        iVar85 = uVar76 + 0xf;
                        uVar76 = uVar76 + 8;
                      }
                      uVar60 = uVar76 | 3;
                      while ((int)uVar60 < (int)uVar82) {
                        if (iVar58 == 0) {
                          if (pfVar70 == (float *)0x0) {
                            fVar103 = 0.0;
                            fVar108 = 0.0;
                            fVar109 = 0.0;
                            fVar110 = 0.0;
                            fVar104 = 0.0;
                            fVar105 = 0.0;
                            fVar106 = 0.0;
                            fVar107 = 0.0;
                          }
                          else {
                            fVar103 = *pfVar70;
                            fVar104 = pfVar70[1];
                            fVar105 = fVar104;
                            fVar106 = fVar104;
                            fVar107 = fVar104;
                            fVar108 = fVar103;
                            fVar109 = fVar103;
                            fVar110 = fVar103;
                          }
                        }
                        else {
                          fVar103 = *pfVar75;
                          fVar104 = pfVar75[1];
                          fVar105 = pfVar75[3];
                          fVar106 = pfVar75[5];
                          fVar107 = pfVar75[7];
                          fVar108 = pfVar75[2];
                          fVar109 = pfVar75[4];
                          fVar110 = pfVar75[6];
                        }
                        if (0 < iVar81) {
                          lVar86 = 0;
                          do {
                            fVar111 = pfVar72[lVar86 * 2];
                            fVar112 = pfVar72[lVar86 * 2 + 1];
                            fVar103 = fVar103 + fVar111 * *pfVar91;
                            fVar108 = fVar108 + fVar111 * pfVar91[1];
                            fVar109 = fVar109 + fVar111 * pfVar91[2];
                            fVar110 = fVar110 + fVar111 * pfVar91[3];
                            fVar104 = fVar104 + fVar112 * *pfVar91;
                            fVar105 = fVar105 + fVar112 * pfVar91[1];
                            fVar106 = fVar106 + fVar112 * pfVar91[2];
                            fVar107 = fVar107 + fVar112 * pfVar91[3];
                            pfVar91 = pfVar91 + 4;
                            lVar86 = lVar86 + 1;
                          } while ((int)lVar63 != (int)lVar86);
                        }
                        if (iVar61 < iVar80) {
                          *pfVar75 = fVar103;
                          pfVar75[1] = fVar104;
                          pfVar75[2] = fVar108;
                          pfVar75[3] = fVar105;
                          pfVar75[4] = fVar109;
                          pfVar75[5] = fVar106;
                          pfVar75[6] = fVar110;
                          pfVar75[7] = fVar107;
                        }
                        else {
                          *pfVar68 = fVar103;
                          pfVar68[1] = fVar108;
                          pfVar68[2] = fVar109;
                          pfVar68[3] = fVar110;
                          pfVar66 = pfVar68 + lVar73;
                          *pfVar66 = fVar104;
                          pfVar66[1] = fVar105;
                          pfVar66[2] = fVar106;
                          pfVar66[3] = fVar107;
                          pfVar68 = pfVar68 + 4;
                        }
                        pfVar75 = pfVar75 + 8;
                        uVar60 = uVar76 + 7;
                        uVar76 = uVar76 + 4;
                      }
                      uVar60 = uVar76 | 1;
                      while ((int)uVar60 < (int)uVar82) {
                        if (iVar58 == 0) {
                          if (pfVar70 == (float *)0x0) {
                            fVar103 = 0.0;
                            fVar104 = 0.0;
                            fVar105 = 0.0;
                            fVar106 = 0.0;
                          }
                          else {
                            fVar103 = pfVar70[2];
                            fVar104 = pfVar70[3];
                            fVar105 = fVar103;
                            fVar106 = fVar104;
                          }
                        }
                        else {
                          fVar103 = *pfVar75;
                          fVar104 = pfVar75[1];
                          fVar105 = pfVar75[2];
                          fVar106 = pfVar75[3];
                        }
                        if (0 < iVar81) {
                          lVar86 = 0;
                          lVar77 = 0;
                          do {
                            fVar107 = (float)*(undefined8 *)(pfVar72 + lVar77 * 2);
                            fVar108 = (float)((ulong)*(undefined8 *)(pfVar72 + lVar77 * 2) >> 0x20);
                            fVar109 = (float)*(undefined8 *)(pfVar91 + lVar77 * 2);
                            fVar110 = (float)((ulong)*(undefined8 *)(pfVar91 + lVar77 * 2) >> 0x20);
                            fVar103 = fVar103 + fVar109 * fVar107;
                            fVar104 = fVar104 + fVar109 * fVar108;
                            fVar105 = fVar105 + fVar110 * fVar107;
                            fVar106 = fVar106 + fVar110 * fVar108;
                            lVar77 = lVar77 + 1;
                            lVar86 = lVar86 + -8;
                          } while (iVar84 != (int)lVar77);
                          pfVar91 = (float *)((long)pfVar91 - lVar86);
                        }
                        if (iVar61 < iVar80) {
                          *pfVar75 = fVar103;
                          pfVar75[1] = fVar104;
                          pfVar75[2] = fVar105;
                          pfVar75[3] = fVar106;
                        }
                        else {
                          *(ulong *)pfVar68 = CONCAT44(fVar105,fVar103);
                          pfVar68[lVar73] = fVar104;
                          pfVar68[(long)((local_90 << 0x20) + 0x100000000) >> 0x20] = fVar106;
                          pfVar68 = pfVar68 + 2;
                        }
                        pfVar75 = pfVar75 + 4;
                        uVar60 = uVar76 + 3;
                        uVar76 = uVar76 + 2;
                      }
                      if ((int)uVar76 < (int)uVar82) {
                        do {
                          pfVar66 = pfVar75;
                          if (iVar58 == 0) {
                            fVar103 = 0.0;
                            fVar104 = 0.0;
                            pfVar66 = pfVar70;
                            if (pfVar70 != (float *)0x0) goto LAB_0015b653;
                          }
                          else {
LAB_0015b653:
                            fVar103 = *pfVar66;
                            fVar104 = pfVar66[1];
                          }
                          if (0 < iVar81) {
                            lVar86 = 0;
                            do {
                              fVar103 = fVar103 + *pfVar91 *
                                                  (float)*(undefined8 *)(pfVar72 + lVar86 * 2);
                              fVar104 = fVar104 + *pfVar91 *
                                                  (float)((ulong)*(undefined8 *)
                                                                  (pfVar72 + lVar86 * 2) >> 0x20);
                              pfVar91 = pfVar91 + 1;
                              lVar86 = lVar86 + 1;
                            } while (iVar84 != (int)lVar86);
                          }
                          if (iVar61 < iVar80) {
                            *pfVar75 = fVar103;
                            pfVar75[1] = fVar104;
                          }
                          else {
                            *pfVar68 = fVar103;
                            pfVar68[lVar73] = fVar104;
                            pfVar68 = pfVar68 + 1;
                          }
                          pfVar75 = pfVar75 + 2;
                          uVar76 = uVar76 + 1;
                        } while (uVar76 != uVar82);
                      }
                      pfVar72 = pfVar72 + iVar81 * 2;
                      uVar78 = local_c0 + 2;
                      pfVar68 = pfVar70;
                      uVar74 = uVar78;
                    } while ((long)(local_c0 + 3) < (long)local_88);
                  }
                  if ((int)uVar78 < (int)uVar65) {
                    uVar78 = uVar78 & 0xffffffff;
                    do {
                      pfVar68 = (float *)((long)(this->super_Convolution).bias_data.data +
                                         uVar78 * 4 + local_a8 * 4);
                      if (pfVar70 == (float *)0x0) {
                        pfVar68 = pfVar70;
                      }
                      uVar76 = 0;
                      pfVar70 = (float *)((long)top_blob->data +
                                         local_68 * 4 + (uVar78 + local_a8) * (long)iVar71 * 4);
                      pfVar91 = local_128;
                      if (0xb < (int)uVar82) {
                        uVar60 = 0;
                        do {
                          if (iVar58 == 0) {
                            if (pfVar68 == (float *)0x0) {
                              fVar111 = 0.0;
                              fVar112 = 0.0;
                              fVar113 = 0.0;
                              fVar114 = 0.0;
                              fVar103 = 0.0;
                              fVar104 = 0.0;
                              fVar105 = 0.0;
                              fVar106 = 0.0;
                              fVar107 = 0.0;
                              fVar108 = 0.0;
                              fVar109 = 0.0;
                              fVar110 = 0.0;
                            }
                            else {
                              fVar103 = *pfVar68;
                              fVar104 = fVar103;
                              fVar105 = fVar103;
                              fVar106 = fVar103;
                              fVar107 = fVar103;
                              fVar108 = fVar103;
                              fVar109 = fVar103;
                              fVar110 = fVar103;
                              fVar111 = fVar103;
                              fVar112 = fVar103;
                              fVar113 = fVar103;
                              fVar114 = fVar103;
                            }
                          }
                          else {
                            fVar103 = pfVar75[4];
                            fVar104 = pfVar75[5];
                            fVar105 = pfVar75[6];
                            fVar106 = pfVar75[7];
                            fVar107 = pfVar75[8];
                            fVar108 = pfVar75[9];
                            fVar109 = pfVar75[10];
                            fVar110 = pfVar75[0xb];
                            fVar111 = *pfVar75;
                            fVar112 = pfVar75[1];
                            fVar113 = pfVar75[2];
                            fVar114 = pfVar75[3];
                          }
                          if (0 < iVar81) {
                            lVar86 = 0;
                            do {
                              fVar115 = pfVar72[lVar86];
                              fVar111 = fVar111 + *pfVar91 * fVar115;
                              fVar112 = fVar112 + pfVar91[1] * fVar115;
                              fVar113 = fVar113 + pfVar91[2] * fVar115;
                              fVar114 = fVar114 + pfVar91[3] * fVar115;
                              fVar103 = fVar103 + pfVar91[4] * fVar115;
                              fVar104 = fVar104 + pfVar91[5] * fVar115;
                              fVar105 = fVar105 + pfVar91[6] * fVar115;
                              fVar106 = fVar106 + pfVar91[7] * fVar115;
                              fVar107 = fVar107 + fVar115 * pfVar91[8];
                              fVar108 = fVar108 + fVar115 * pfVar91[9];
                              fVar109 = fVar109 + fVar115 * pfVar91[10];
                              fVar110 = fVar110 + fVar115 * pfVar91[0xb];
                              pfVar91 = pfVar91 + 0xc;
                              lVar86 = lVar86 + 1;
                            } while (iVar81 != (int)lVar86);
                          }
                          if (iVar61 < iVar80) {
                            *pfVar75 = fVar111;
                            pfVar75[1] = fVar112;
                            pfVar75[2] = fVar113;
                            pfVar75[3] = fVar114;
                            pfVar75[4] = fVar103;
                            pfVar75[5] = fVar104;
                            pfVar75[6] = fVar105;
                            pfVar75[7] = fVar106;
                            pfVar75[8] = fVar107;
                            pfVar75[9] = fVar108;
                            pfVar75[10] = fVar109;
                            pfVar75[0xb] = fVar110;
                          }
                          else {
                            *pfVar70 = fVar111;
                            pfVar70[1] = fVar112;
                            pfVar70[2] = fVar113;
                            pfVar70[3] = fVar114;
                            pfVar70[4] = fVar103;
                            pfVar70[5] = fVar104;
                            pfVar70[6] = fVar105;
                            pfVar70[7] = fVar106;
                            pfVar70[8] = fVar107;
                            pfVar70[9] = fVar108;
                            pfVar70[10] = fVar109;
                            pfVar70[0xb] = fVar110;
                            pfVar70 = pfVar70 + 0xc;
                          }
                          pfVar75 = pfVar75 + 0xc;
                          uVar76 = uVar60 + 0xc;
                          iVar84 = uVar60 + 0x17;
                          uVar60 = uVar76;
                        } while (iVar84 < (int)uVar82);
                      }
                      iVar84 = uVar76 + 7;
                      while (iVar84 < (int)uVar82) {
                        if (iVar58 == 0) {
                          if (pfVar68 == (float *)0x0) {
                            fVar107 = 0.0;
                            fVar108 = 0.0;
                            fVar109 = 0.0;
                            fVar110 = 0.0;
                            fVar103 = 0.0;
                            fVar104 = 0.0;
                            fVar105 = 0.0;
                            fVar106 = 0.0;
                          }
                          else {
                            fVar103 = *pfVar68;
                            fVar104 = fVar103;
                            fVar105 = fVar103;
                            fVar106 = fVar103;
                            fVar107 = fVar103;
                            fVar108 = fVar103;
                            fVar109 = fVar103;
                            fVar110 = fVar103;
                          }
                        }
                        else {
                          fVar103 = pfVar75[4];
                          fVar104 = pfVar75[5];
                          fVar105 = pfVar75[6];
                          fVar106 = pfVar75[7];
                          fVar107 = *pfVar75;
                          fVar108 = pfVar75[1];
                          fVar109 = pfVar75[2];
                          fVar110 = pfVar75[3];
                        }
                        if (0 < iVar81) {
                          lVar86 = 0;
                          do {
                            fVar111 = pfVar72[lVar86];
                            fVar107 = fVar107 + *pfVar91 * fVar111;
                            fVar108 = fVar108 + pfVar91[1] * fVar111;
                            fVar109 = fVar109 + pfVar91[2] * fVar111;
                            fVar110 = fVar110 + pfVar91[3] * fVar111;
                            fVar103 = fVar103 + fVar111 * pfVar91[4];
                            fVar104 = fVar104 + fVar111 * pfVar91[5];
                            fVar105 = fVar105 + fVar111 * pfVar91[6];
                            fVar106 = fVar106 + fVar111 * pfVar91[7];
                            pfVar91 = pfVar91 + 8;
                            lVar86 = lVar86 + 1;
                          } while (iVar81 != (int)lVar86);
                        }
                        if (iVar61 < iVar80) {
                          *pfVar75 = fVar107;
                          pfVar75[1] = fVar108;
                          pfVar75[2] = fVar109;
                          pfVar75[3] = fVar110;
                          pfVar75[4] = fVar103;
                          pfVar75[5] = fVar104;
                          pfVar75[6] = fVar105;
                          pfVar75[7] = fVar106;
                        }
                        else {
                          *pfVar70 = fVar107;
                          pfVar70[1] = fVar108;
                          pfVar70[2] = fVar109;
                          pfVar70[3] = fVar110;
                          pfVar70[4] = fVar103;
                          pfVar70[5] = fVar104;
                          pfVar70[6] = fVar105;
                          pfVar70[7] = fVar106;
                          pfVar70 = pfVar70 + 8;
                        }
                        pfVar75 = pfVar75 + 8;
                        iVar84 = uVar76 + 0xf;
                        uVar76 = uVar76 + 8;
                      }
                      uVar60 = uVar76 | 3;
                      while ((int)uVar60 < (int)uVar82) {
                        if (iVar58 == 0) {
                          if (pfVar68 == (float *)0x0) {
                            fVar103 = 0.0;
                            fVar104 = 0.0;
                            fVar105 = 0.0;
                            fVar106 = 0.0;
                          }
                          else {
                            fVar103 = *pfVar68;
                            fVar104 = fVar103;
                            fVar105 = fVar103;
                            fVar106 = fVar103;
                          }
                        }
                        else {
                          fVar103 = *pfVar75;
                          fVar104 = pfVar75[1];
                          fVar105 = pfVar75[2];
                          fVar106 = pfVar75[3];
                        }
                        if (0 < iVar81) {
                          lVar86 = 0;
                          do {
                            fVar107 = pfVar72[lVar86];
                            fVar103 = fVar103 + fVar107 * *pfVar91;
                            fVar104 = fVar104 + fVar107 * pfVar91[1];
                            fVar105 = fVar105 + fVar107 * pfVar91[2];
                            fVar106 = fVar106 + fVar107 * pfVar91[3];
                            pfVar91 = pfVar91 + 4;
                            lVar86 = lVar86 + 1;
                          } while (iVar81 != (int)lVar86);
                        }
                        if (iVar61 < iVar80) {
                          *pfVar75 = fVar103;
                          pfVar75[1] = fVar104;
                          pfVar75[2] = fVar105;
                          pfVar75[3] = fVar106;
                        }
                        else {
                          *pfVar70 = fVar103;
                          pfVar70[1] = fVar104;
                          pfVar70[2] = fVar105;
                          pfVar70[3] = fVar106;
                          pfVar70 = pfVar70 + 4;
                        }
                        pfVar75 = pfVar75 + 4;
                        uVar60 = uVar76 + 7;
                        uVar76 = uVar76 + 4;
                      }
                      uVar60 = uVar76 | 1;
                      while ((int)uVar60 < (int)uVar82) {
                        if (iVar58 == 0) {
                          if (pfVar68 == (float *)0x0) {
                            fVar103 = 0.0;
                            fVar104 = 0.0;
                          }
                          else {
                            fVar103 = *pfVar68;
                            fVar104 = fVar103;
                          }
                        }
                        else {
                          fVar103 = *pfVar75;
                          fVar104 = pfVar75[1];
                        }
                        if (0 < iVar81) {
                          lVar86 = 0;
                          lVar63 = 0;
                          do {
                            fVar103 = fVar103 + pfVar72[lVar63] *
                                                (float)*(undefined8 *)(pfVar91 + lVar63 * 2);
                            fVar104 = fVar104 + pfVar72[lVar63] *
                                                (float)((ulong)*(undefined8 *)(pfVar91 + lVar63 * 2)
                                                       >> 0x20);
                            lVar63 = lVar63 + 1;
                            lVar86 = lVar86 + -8;
                          } while (iVar81 != (int)lVar63);
                          pfVar91 = (float *)((long)pfVar91 - lVar86);
                        }
                        if (iVar61 < iVar80) {
                          *pfVar75 = fVar103;
                          pfVar75[1] = fVar104;
                        }
                        else {
                          *pfVar70 = fVar103;
                          pfVar70[1] = fVar104;
                          pfVar70 = pfVar70 + 2;
                        }
                        pfVar75 = pfVar75 + 2;
                        uVar60 = uVar76 + 3;
                        uVar76 = uVar76 + 2;
                      }
                      if ((int)uVar76 < (int)uVar82) {
                        do {
                          fVar103 = 0.0;
                          if (pfVar68 != (float *)0x0 || iVar58 != 0) {
                            pfVar66 = pfVar68;
                            if (iVar58 != 0) {
                              pfVar66 = pfVar75;
                            }
                            fVar103 = *pfVar66;
                          }
                          if (0 < iVar81) {
                            lVar86 = 0;
                            do {
                              fVar103 = fVar103 + *pfVar91 * pfVar72[lVar86];
                              pfVar91 = pfVar91 + 1;
                              lVar86 = lVar86 + 1;
                            } while (iVar81 != (int)lVar86);
                          }
                          if (iVar61 < iVar80) {
                            *pfVar75 = fVar103;
                          }
                          else {
                            *pfVar70 = fVar103;
                            pfVar70 = pfVar70 + 1;
                          }
                          pfVar75 = pfVar75 + 1;
                          uVar76 = uVar76 + 1;
                        } while (uVar76 != uVar82);
                      }
                      uVar78 = uVar78 + 1;
                      pfVar72 = pfVar72 + iVar81;
                      pfVar70 = pfVar68;
                    } while (uVar78 != local_b0);
                  }
                  iVar58 = iVar58 + TILE_K;
                } while (iVar58 < iVar80);
              }
              uVar78 = local_98;
              iVar58 = local_1cc + TILE_N;
            } while (local_1cc + TILE_N < (int)local_98);
          }
          uVar65 = (int)local_58 + 1;
          local_58 = (ulong)uVar65;
        } while (uVar65 != local_9c);
      }
      iVar62 = 0;
    }
    piVar2 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_178.allocator == (Allocator *)0x0) {
          if ((void *)CONCAT44(local_178.data._4_4_,local_178.data._0_4_) != (void *)0x0) {
            free((void *)CONCAT44(local_178.data._4_4_,local_178.data._0_4_));
          }
        }
        else {
          (*(local_178.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_178.cstep = 0;
    local_178.data._0_4_ = 0;
    local_178.data._4_4_ = 0;
    local_178.refcount._0_4_ = 0;
    local_178.refcount._4_4_ = 0;
    local_178.elemsize._0_4_ = 0;
    local_178.elemsize._4_4_ = 0;
    local_178.elempack = 0;
    local_178.dims = 0;
    local_178.w = 0;
    local_178.h = 0;
    local_178.d = 0;
    local_178.c = 0;
  }
  piVar2 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_118.allocator == (Allocator *)0x0) {
        if (local_118.data != (void *)0x0) {
          free(local_118.data);
        }
      }
      else {
        (*(local_118.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_118.cstep = 0;
  local_118.data = (void *)0x0;
  local_118.refcount._0_4_ = 0;
  local_118.refcount._4_4_ = 0;
  local_118.elemsize._0_4_ = 0;
  local_118.elemsize._4_4_ = 0;
  local_118.elempack = 0;
  local_118.dims = 0;
  local_118.w = 0;
  local_118.h = 0;
  local_118.d = 0;
  local_118.c = 0;
  if (iVar62 == 0) {
    pLVar4 = this->activation;
    iVar62 = 0;
    if (pLVar4 != (Layer *)0x0) {
      (*pLVar4->_vptr_Layer[9])(pLVar4,top_blob,opt);
      iVar62 = 0;
    }
  }
LAB_0015bfed:
  piVar2 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
  if (piVar2 == (int *)0x0) {
    return iVar62;
  }
  LOCK();
  *piVar2 = *piVar2 + -1;
  UNLOCK();
  if (*piVar2 != 0) {
    return iVar62;
  }
  if (local_1c8.allocator != (Allocator *)0x0) {
    (*(local_1c8.allocator)->_vptr_Allocator[3])();
    return iVar62;
  }
  if (local_1c8.data == (void *)0x0) {
    return iVar62;
  }
  free(local_1c8.data);
  return iVar62;
}

Assistant:

int Convolution_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    // flattened blob, implement as InnerProduct
    if (bottom_blob.dims == 1 && kernel_w == 1 && kernel_h == 1)
    {
        Mat bottom_blob_3d;
        if (bottom_blob.elemsize % 16 == 0)
        {
            bottom_blob_3d = bottom_blob;
            bottom_blob_3d.dims = 3;
            bottom_blob_3d.w = 1;
            bottom_blob_3d.h = 1;
            bottom_blob_3d.c = bottom_blob.w;
            bottom_blob_3d.cstep = 1;
        }
        else
        {
            bottom_blob_3d = bottom_blob.reshape(1, 1, bottom_blob.w, opt.workspace_allocator);
            if (bottom_blob_3d.empty())
                return -100;
        }

        Mat top_blob_3d;
        int ret = forward(bottom_blob_3d, top_blob_3d, opt);
        if (ret != 0)
            return ret;

        if (top_blob_3d.elemsize % 16 == 0)
        {
            top_blob = top_blob_3d;
            top_blob.dims = 1;
            top_blob.w = top_blob_3d.c;
            top_blob.h = 1;
            top_blob.c = 1;
            bottom_blob_3d.cstep = top_blob_3d.c;
        }
        else
        {
            top_blob = top_blob_3d.reshape(top_blob_3d.c, opt.blob_allocator);
            if (top_blob.empty())
                return -100;
        }

        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        if (outw >= dilation_w && outh >= dilation_h)
        {
            return forwardDilation_x86(bottom_blob_bordered, top_blob, opt);
        }
    }

    const int num_input = channels * elempack;

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        bool prefer_winograd63 = test_prefer_winograd63(num_input, num_output, w, h);
        bool prefer_winograd23 = test_prefer_winograd23(num_input, num_output, w, h);
        bool prefer_winograd43 = !prefer_winograd63 && !prefer_winograd23;

        if (prefer_winograd23 && (!opt.use_winograd23_convolution || weight_winograd23_data.empty()))
        {
            // f23 fallback to f43
            prefer_winograd23 = false;
            prefer_winograd43 = true;
        }

        if (prefer_winograd63 && (!opt.use_winograd63_convolution || weight_winograd63_data.empty()))
        {
            // f63 fallback to f43
            prefer_winograd63 = false;
            prefer_winograd43 = true;
        }

        if (prefer_winograd43 && (!opt.use_winograd43_convolution || weight_winograd43_data.empty()))
        {
            // f43 fallback to f63 or f23
            prefer_winograd43 = false;
            if (opt.use_winograd63_convolution && !weight_winograd63_data.empty())
            {
                prefer_winograd63 = true;
            }
            else
            {
                prefer_winograd23 = true;
            }
        }

        int _nT = nT ? nT : opt.num_threads;
        if (nT != 0 && opt.num_threads != nT)
        {
            // force num_threads the same as in create_pipeline
            // so we could use pre-packed A/B from the same tile config
            NCNN_LOGE("opt.num_threads %d changed, convolution winograd will use load-time value %d", opt.num_threads, nT);
        }

        int ret = 0;
        if (prefer_winograd23)
        {
            ret = conv3x3s1_winograd23(bottom_blob_bordered, top_blob, weight_winograd23_data, bias_data, _nT, opt);
        }
        else if (prefer_winograd43)
        {
            ret = conv3x3s1_winograd43(bottom_blob_bordered, top_blob, weight_winograd43_data, bias_data, _nT, opt);
        }
        else if (prefer_winograd63)
        {
            ret = conv3x3s1_winograd63(bottom_blob_bordered, top_blob, weight_winograd63_data, bias_data, _nT, opt);
        }
        else
        {
            // should never reach here
        }
        if (ret != 0)
            return ret;

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
        return 0;
    }

    int l2_cache_size = get_cpu_level2_cache_size();
    bool prefer_sgemm = num_input * num_output * kernel_w * kernel_h * dilation_w * dilation_h * stride_w * stride_h * (int)sizeof(float) * 2 > l2_cache_size || (num_input > 16 || num_output > 16);

    if ((opt.use_sgemm_convolution && prefer_sgemm) || (kernel_w == 1 && kernel_h == 1))
    {
        int _nT = nT ? nT : opt.num_threads;
        if (nT != 0 && opt.num_threads != nT)
        {
            // force num_threads the same as in create_pipeline
            // so we could use pre-packed A/B from the same tile config
            NCNN_LOGE("opt.num_threads %d changed, convolution gemm will use load-time value %d", opt.num_threads, nT);
        }

        int ret = convolution_im2col_gemm(bottom_blob_bordered, top_blob, weight_sgemm_data, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, _nT, opt);
        if (ret != 0)
            return ret;

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
        return 0;
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16 && out_elempack == 1)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack16to1_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }
#endif // __AVX512F__

    if (elempack == 8 && out_elempack == 8)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
        if (kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv2x2s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack1to8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv3x3s2_pack1to8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack8to1_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }
#endif // __AVX__

    if (elempack == 1 && out_elempack == 4)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack1to4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv3x3s2_pack1to4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }
#endif // __SSE2__

    convolution_packed(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);

    return 0;
}